

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx512::CurveNvIntersectorK<8,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  int iVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  long lVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  byte bVar63;
  ulong uVar64;
  uint uVar65;
  ulong uVar66;
  ulong uVar67;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  long lVar68;
  Geometry *pGVar69;
  byte bVar70;
  ulong uVar71;
  float fVar72;
  float fVar118;
  float fVar120;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar78 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar79 [16];
  float fVar119;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar124;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar125;
  undefined4 uVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar132;
  undefined1 auVar131 [32];
  float fVar133;
  undefined8 uVar134;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar140;
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar153;
  float fVar154;
  float fVar156;
  float fVar157;
  undefined1 auVar155 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  undefined1 local_5f0 [16];
  Precalculations *local_5e0;
  ulong local_5d8;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  Geometry *local_598;
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [32];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined4 local_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 local_2f0 [16];
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  uint local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  int local_23c;
  undefined1 local_230 [16];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar171 [64];
  
  PVar9 = prim[1];
  uVar64 = (ulong)(byte)PVar9;
  lVar60 = uVar64 * 0x19;
  fVar133 = *(float *)(prim + lVar60 + 0x12);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar78 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar137 = vsubps_avx(auVar75,*(undefined1 (*) [16])(prim + lVar60 + 6));
  fVar140 = fVar133 * auVar137._0_4_;
  fVar125 = fVar133 * auVar78._0_4_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar64 * 4 + 6);
  auVar86 = vpmovsxbd_avx2(auVar75);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar64 * 5 + 6);
  auVar83 = vpmovsxbd_avx2(auVar77);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar64 * 6 + 6);
  auVar84 = vpmovsxbd_avx2(auVar74);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar64 * 0xb + 6);
  auVar85 = vpmovsxbd_avx2(auVar73);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6);
  auVar90 = vpmovsxbd_avx2(auVar5);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar88 = vcvtdq2ps_avx(auVar90);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (uint)(byte)PVar9 * 0xc + uVar64 + 6);
  auVar87 = vpmovsxbd_avx2(auVar6);
  auVar87 = vcvtdq2ps_avx(auVar87);
  uVar66 = (ulong)(uint)((int)(uVar64 * 9) * 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar66 + 6);
  auVar96 = vpmovsxbd_avx2(auVar7);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar66 + uVar64 + 6);
  auVar95 = vpmovsxbd_avx2(auVar8);
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar71 = (ulong)(uint)((int)(uVar64 * 5) << 2);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar71 + 6);
  auVar82 = vpmovsxbd_avx2(auVar76);
  auVar89 = vcvtdq2ps_avx(auVar82);
  auVar167._4_4_ = fVar125;
  auVar167._0_4_ = fVar125;
  auVar167._8_4_ = fVar125;
  auVar167._12_4_ = fVar125;
  auVar167._16_4_ = fVar125;
  auVar167._20_4_ = fVar125;
  auVar167._24_4_ = fVar125;
  auVar167._28_4_ = fVar125;
  auVar172._8_4_ = 1;
  auVar172._0_8_ = 0x100000001;
  auVar172._12_4_ = 1;
  auVar172._16_4_ = 1;
  auVar172._20_4_ = 1;
  auVar172._24_4_ = 1;
  auVar172._28_4_ = 1;
  auVar80 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar92 = ZEXT1632(CONCAT412(fVar133 * auVar78._12_4_,
                               CONCAT48(fVar133 * auVar78._8_4_,
                                        CONCAT44(fVar133 * auVar78._4_4_,fVar125))));
  auVar91 = vpermps_avx2(auVar172,auVar92);
  auVar81 = vpermps_avx512vl(auVar80,auVar92);
  fVar125 = auVar81._0_4_;
  fVar141 = auVar81._4_4_;
  auVar92._4_4_ = fVar141 * auVar84._4_4_;
  auVar92._0_4_ = fVar125 * auVar84._0_4_;
  fVar132 = auVar81._8_4_;
  auVar92._8_4_ = fVar132 * auVar84._8_4_;
  fVar154 = auVar81._12_4_;
  auVar92._12_4_ = fVar154 * auVar84._12_4_;
  fVar157 = auVar81._16_4_;
  auVar92._16_4_ = fVar157 * auVar84._16_4_;
  fVar153 = auVar81._20_4_;
  auVar92._20_4_ = fVar153 * auVar84._20_4_;
  fVar156 = auVar81._24_4_;
  auVar92._24_4_ = fVar156 * auVar84._24_4_;
  auVar92._28_4_ = auVar90._28_4_;
  auVar90._4_4_ = auVar87._4_4_ * fVar141;
  auVar90._0_4_ = auVar87._0_4_ * fVar125;
  auVar90._8_4_ = auVar87._8_4_ * fVar132;
  auVar90._12_4_ = auVar87._12_4_ * fVar154;
  auVar90._16_4_ = auVar87._16_4_ * fVar157;
  auVar90._20_4_ = auVar87._20_4_ * fVar153;
  auVar90._24_4_ = auVar87._24_4_ * fVar156;
  auVar90._28_4_ = auVar82._28_4_;
  auVar82._4_4_ = auVar89._4_4_ * fVar141;
  auVar82._0_4_ = auVar89._0_4_ * fVar125;
  auVar82._8_4_ = auVar89._8_4_ * fVar132;
  auVar82._12_4_ = auVar89._12_4_ * fVar154;
  auVar82._16_4_ = auVar89._16_4_ * fVar157;
  auVar82._20_4_ = auVar89._20_4_ * fVar153;
  auVar82._24_4_ = auVar89._24_4_ * fVar156;
  auVar82._28_4_ = auVar81._28_4_;
  auVar75 = vfmadd231ps_fma(auVar92,auVar91,auVar83);
  auVar77 = vfmadd231ps_fma(auVar90,auVar91,auVar88);
  auVar74 = vfmadd231ps_fma(auVar82,auVar95,auVar91);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar167,auVar86);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar167,auVar85);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar96,auVar167);
  auVar168._4_4_ = fVar140;
  auVar168._0_4_ = fVar140;
  auVar168._8_4_ = fVar140;
  auVar168._12_4_ = fVar140;
  auVar168._16_4_ = fVar140;
  auVar168._20_4_ = fVar140;
  auVar168._24_4_ = fVar140;
  auVar168._28_4_ = fVar140;
  auVar82 = ZEXT1632(CONCAT412(fVar133 * auVar137._12_4_,
                               CONCAT48(fVar133 * auVar137._8_4_,
                                        CONCAT44(fVar133 * auVar137._4_4_,fVar140))));
  auVar90 = vpermps_avx2(auVar172,auVar82);
  auVar82 = vpermps_avx512vl(auVar80,auVar82);
  fVar133 = auVar82._0_4_;
  fVar125 = auVar82._4_4_;
  auVar91._4_4_ = fVar125 * auVar84._4_4_;
  auVar91._0_4_ = fVar133 * auVar84._0_4_;
  fVar141 = auVar82._8_4_;
  auVar91._8_4_ = fVar141 * auVar84._8_4_;
  fVar132 = auVar82._12_4_;
  auVar91._12_4_ = fVar132 * auVar84._12_4_;
  fVar154 = auVar82._16_4_;
  auVar91._16_4_ = fVar154 * auVar84._16_4_;
  fVar157 = auVar82._20_4_;
  auVar91._20_4_ = fVar157 * auVar84._20_4_;
  fVar153 = auVar82._24_4_;
  auVar91._24_4_ = fVar153 * auVar84._24_4_;
  auVar91._28_4_ = 1;
  auVar80._4_4_ = auVar87._4_4_ * fVar125;
  auVar80._0_4_ = auVar87._0_4_ * fVar133;
  auVar80._8_4_ = auVar87._8_4_ * fVar141;
  auVar80._12_4_ = auVar87._12_4_ * fVar132;
  auVar80._16_4_ = auVar87._16_4_ * fVar154;
  auVar80._20_4_ = auVar87._20_4_ * fVar157;
  auVar80._24_4_ = auVar87._24_4_ * fVar153;
  auVar80._28_4_ = auVar84._28_4_;
  auVar87._4_4_ = auVar89._4_4_ * fVar125;
  auVar87._0_4_ = auVar89._0_4_ * fVar133;
  auVar87._8_4_ = auVar89._8_4_ * fVar141;
  auVar87._12_4_ = auVar89._12_4_ * fVar132;
  auVar87._16_4_ = auVar89._16_4_ * fVar154;
  auVar87._20_4_ = auVar89._20_4_ * fVar157;
  auVar87._24_4_ = auVar89._24_4_ * fVar153;
  auVar87._28_4_ = auVar82._28_4_;
  auVar73 = vfmadd231ps_fma(auVar91,auVar90,auVar83);
  auVar5 = vfmadd231ps_fma(auVar80,auVar90,auVar88);
  auVar6 = vfmadd231ps_fma(auVar87,auVar90,auVar95);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar168,auVar86);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar168,auVar85);
  auVar158._8_4_ = 0x7fffffff;
  auVar158._0_8_ = 0x7fffffff7fffffff;
  auVar158._12_4_ = 0x7fffffff;
  auVar158._16_4_ = 0x7fffffff;
  auVar158._20_4_ = 0x7fffffff;
  auVar158._24_4_ = 0x7fffffff;
  auVar158._28_4_ = 0x7fffffff;
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar168,auVar96);
  auVar86 = vandps_avx(ZEXT1632(auVar75),auVar158);
  auVar155._8_4_ = 0x219392ef;
  auVar155._0_8_ = 0x219392ef219392ef;
  auVar155._12_4_ = 0x219392ef;
  auVar155._16_4_ = 0x219392ef;
  auVar155._20_4_ = 0x219392ef;
  auVar155._24_4_ = 0x219392ef;
  auVar155._28_4_ = 0x219392ef;
  uVar66 = vcmpps_avx512vl(auVar86,auVar155,1);
  bVar12 = (bool)((byte)uVar66 & 1);
  auVar81._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar75._0_4_;
  bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar75._4_4_;
  bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar75._8_4_;
  bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar75._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar77),auVar158);
  uVar66 = vcmpps_avx512vl(auVar86,auVar155,1);
  bVar12 = (bool)((byte)uVar66 & 1);
  auVar93._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar77._0_4_;
  bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar77._4_4_;
  bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar77._8_4_;
  bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar77._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar74),auVar158);
  uVar66 = vcmpps_avx512vl(auVar86,auVar155,1);
  bVar12 = (bool)((byte)uVar66 & 1);
  auVar86._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar74._0_4_;
  bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar74._4_4_;
  bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar74._8_4_;
  bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar74._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar83 = vrcp14ps_avx512vl(auVar81);
  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar85 = vfnmadd213ps_avx512vl(auVar81,auVar83,auVar84);
  auVar75 = vfmadd132ps_fma(auVar85,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar93);
  auVar85 = vfnmadd213ps_avx512vl(auVar93,auVar83,auVar84);
  auVar77 = vfmadd132ps_fma(auVar85,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar86);
  auVar86 = vfnmadd213ps_avx512vl(auVar86,auVar83,auVar84);
  auVar74 = vfmadd132ps_fma(auVar86,auVar83,auVar83);
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar64 * 7 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar73));
  auVar96._4_4_ = auVar75._4_4_ * auVar86._4_4_;
  auVar96._0_4_ = auVar75._0_4_ * auVar86._0_4_;
  auVar96._8_4_ = auVar75._8_4_ * auVar86._8_4_;
  auVar96._12_4_ = auVar75._12_4_ * auVar86._12_4_;
  auVar96._16_4_ = auVar86._16_4_ * 0.0;
  auVar96._20_4_ = auVar86._20_4_ * 0.0;
  auVar96._24_4_ = auVar86._24_4_ * 0.0;
  auVar96._28_4_ = auVar86._28_4_;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar64 * 9 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar73));
  auVar87 = vpbroadcastd_avx512vl();
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar9 * 0x10 + 6));
  auVar138._0_4_ = auVar75._0_4_ * auVar86._0_4_;
  auVar138._4_4_ = auVar75._4_4_ * auVar86._4_4_;
  auVar138._8_4_ = auVar75._8_4_ * auVar86._8_4_;
  auVar138._12_4_ = auVar75._12_4_ * auVar86._12_4_;
  auVar138._16_4_ = auVar86._16_4_ * 0.0;
  auVar138._20_4_ = auVar86._20_4_ * 0.0;
  auVar138._24_4_ = auVar86._24_4_ * 0.0;
  auVar138._28_4_ = 0;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar9 * 0x10 + uVar64 * -2 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar5));
  auVar95._4_4_ = auVar77._4_4_ * auVar86._4_4_;
  auVar95._0_4_ = auVar77._0_4_ * auVar86._0_4_;
  auVar95._8_4_ = auVar77._8_4_ * auVar86._8_4_;
  auVar95._12_4_ = auVar77._12_4_ * auVar86._12_4_;
  auVar95._16_4_ = auVar86._16_4_ * 0.0;
  auVar95._20_4_ = auVar86._20_4_ * 0.0;
  auVar95._24_4_ = auVar86._24_4_ * 0.0;
  auVar95._28_4_ = auVar86._28_4_;
  auVar86 = vcvtdq2ps_avx(auVar83);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar5));
  auVar135._0_4_ = auVar77._0_4_ * auVar86._0_4_;
  auVar135._4_4_ = auVar77._4_4_ * auVar86._4_4_;
  auVar135._8_4_ = auVar77._8_4_ * auVar86._8_4_;
  auVar135._12_4_ = auVar77._12_4_ * auVar86._12_4_;
  auVar135._16_4_ = auVar86._16_4_ * 0.0;
  auVar135._20_4_ = auVar86._20_4_ * 0.0;
  auVar135._24_4_ = auVar86._24_4_ * 0.0;
  auVar135._28_4_ = 0;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 + uVar64 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar6));
  auVar89._4_4_ = auVar86._4_4_ * auVar74._4_4_;
  auVar89._0_4_ = auVar86._0_4_ * auVar74._0_4_;
  auVar89._8_4_ = auVar86._8_4_ * auVar74._8_4_;
  auVar89._12_4_ = auVar86._12_4_ * auVar74._12_4_;
  auVar89._16_4_ = auVar86._16_4_ * 0.0;
  auVar89._20_4_ = auVar86._20_4_ * 0.0;
  auVar89._24_4_ = auVar86._24_4_ * 0.0;
  auVar89._28_4_ = auVar86._28_4_;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar64 * 0x17 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar6));
  auVar94._0_4_ = auVar74._0_4_ * auVar86._0_4_;
  auVar94._4_4_ = auVar74._4_4_ * auVar86._4_4_;
  auVar94._8_4_ = auVar74._8_4_ * auVar86._8_4_;
  auVar94._12_4_ = auVar74._12_4_ * auVar86._12_4_;
  auVar94._16_4_ = auVar86._16_4_ * 0.0;
  auVar94._20_4_ = auVar86._20_4_ * 0.0;
  auVar94._24_4_ = auVar86._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar86 = vpminsd_avx2(auVar96,auVar138);
  auVar83 = vpminsd_avx2(auVar95,auVar135);
  auVar86 = vmaxps_avx(auVar86,auVar83);
  auVar83 = vpminsd_avx2(auVar89,auVar94);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar84._4_4_ = uVar126;
  auVar84._0_4_ = uVar126;
  auVar84._8_4_ = uVar126;
  auVar84._12_4_ = uVar126;
  auVar84._16_4_ = uVar126;
  auVar84._20_4_ = uVar126;
  auVar84._24_4_ = uVar126;
  auVar84._28_4_ = uVar126;
  auVar83 = vmaxps_avx512vl(auVar83,auVar84);
  auVar86 = vmaxps_avx(auVar86,auVar83);
  auVar83._8_4_ = 0x3f7ffffa;
  auVar83._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar83._12_4_ = 0x3f7ffffa;
  auVar83._16_4_ = 0x3f7ffffa;
  auVar83._20_4_ = 0x3f7ffffa;
  auVar83._24_4_ = 0x3f7ffffa;
  auVar83._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar86,auVar83);
  auVar86 = vpmaxsd_avx2(auVar96,auVar138);
  auVar83 = vpmaxsd_avx2(auVar95,auVar135);
  auVar86 = vminps_avx(auVar86,auVar83);
  auVar83 = vpmaxsd_avx2(auVar89,auVar94);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar85._4_4_ = uVar126;
  auVar85._0_4_ = uVar126;
  auVar85._8_4_ = uVar126;
  auVar85._12_4_ = uVar126;
  auVar85._16_4_ = uVar126;
  auVar85._20_4_ = uVar126;
  auVar85._24_4_ = uVar126;
  auVar85._28_4_ = uVar126;
  auVar83 = vminps_avx512vl(auVar83,auVar85);
  auVar86 = vminps_avx(auVar86,auVar83);
  auVar88._8_4_ = 0x3f800003;
  auVar88._0_8_ = 0x3f8000033f800003;
  auVar88._12_4_ = 0x3f800003;
  auVar88._16_4_ = 0x3f800003;
  auVar88._20_4_ = 0x3f800003;
  auVar88._24_4_ = 0x3f800003;
  auVar88._28_4_ = 0x3f800003;
  auVar86 = vmulps_avx512vl(auVar86,auVar88);
  uVar18 = vpcmpgtd_avx512vl(auVar87,_DAT_01fe9900);
  uVar134 = vcmpps_avx512vl(local_80,auVar86,2);
  if ((byte)((byte)uVar134 & (byte)uVar18) == 0) {
    bVar70 = 0;
  }
  else {
    uVar66 = (ulong)(byte)((byte)uVar134 & (byte)uVar18);
    local_3a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_5e0 = pre;
    do {
      lVar19 = 0;
      for (uVar64 = uVar66; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
        lVar19 = lVar19 + 1;
      }
      uVar66 = uVar66 - 1 & uVar66;
      local_530._0_4_ = *(undefined4 *)(prim + lVar19 * 4 + 6);
      uVar64 = (ulong)(uint)((int)lVar19 << 6);
      local_5d8 = (ulong)*(uint *)(prim + 2);
      pGVar69 = (context->scene->geometries).items[local_5d8].ptr;
      local_5d0 = *(undefined1 (*) [16])(prim + uVar64 + lVar60 + 0x16);
      if (uVar66 != 0) {
        uVar67 = uVar66 - 1 & uVar66;
        for (uVar71 = uVar66; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
        }
        if (uVar67 != 0) {
          for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_510 = *(undefined1 (*) [16])(prim + uVar64 + lVar60 + 0x26);
      local_520 = *(undefined1 (*) [16])(prim + uVar64 + lVar60 + 0x36);
      _local_390 = *(undefined1 (*) [16])(prim + uVar64 + lVar60 + 0x46);
      local_460._0_8_ = pGVar69;
      iVar10 = (int)pGVar69[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar74 = vsubps_avx(local_5d0,auVar75);
      uVar126 = auVar74._0_4_;
      auVar78._4_4_ = uVar126;
      auVar78._0_4_ = uVar126;
      auVar78._8_4_ = uVar126;
      auVar78._12_4_ = uVar126;
      auVar77 = vshufps_avx(auVar74,auVar74,0x55);
      auVar74 = vshufps_avx(auVar74,auVar74,0xaa);
      aVar3 = pre->ray_space[k].vx.field_0;
      aVar4 = pre->ray_space[k].vy.field_0;
      fVar133 = pre->ray_space[k].vz.field_0.m128[0];
      fVar125 = pre->ray_space[k].vz.field_0.m128[1];
      fVar141 = pre->ray_space[k].vz.field_0.m128[2];
      fVar132 = pre->ray_space[k].vz.field_0.m128[3];
      auVar161._0_4_ = fVar133 * auVar74._0_4_;
      auVar161._4_4_ = fVar125 * auVar74._4_4_;
      auVar161._8_4_ = fVar141 * auVar74._8_4_;
      auVar161._12_4_ = fVar132 * auVar74._12_4_;
      auVar77 = vfmadd231ps_fma(auVar161,(undefined1  [16])aVar4,auVar77);
      auVar5 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar3,auVar78);
      auVar77 = vshufps_avx(local_5d0,local_5d0,0xff);
      auVar73 = vsubps_avx(local_510,auVar75);
      uVar126 = auVar73._0_4_;
      auVar142._4_4_ = uVar126;
      auVar142._0_4_ = uVar126;
      auVar142._8_4_ = uVar126;
      auVar142._12_4_ = uVar126;
      auVar74 = vshufps_avx(auVar73,auVar73,0x55);
      auVar73 = vshufps_avx(auVar73,auVar73,0xaa);
      auVar162._0_4_ = fVar133 * auVar73._0_4_;
      auVar162._4_4_ = fVar125 * auVar73._4_4_;
      auVar162._8_4_ = fVar141 * auVar73._8_4_;
      auVar162._12_4_ = fVar132 * auVar73._12_4_;
      auVar74 = vfmadd231ps_fma(auVar162,(undefined1  [16])aVar4,auVar74);
      auVar6 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar3,auVar142);
      auVar73 = vsubps_avx512vl(local_520,auVar75);
      uVar126 = auVar73._0_4_;
      auVar79._4_4_ = uVar126;
      auVar79._0_4_ = uVar126;
      auVar79._8_4_ = uVar126;
      auVar79._12_4_ = uVar126;
      auVar74 = vshufps_avx(auVar73,auVar73,0x55);
      auVar73 = vshufps_avx(auVar73,auVar73,0xaa);
      auVar164._0_4_ = fVar133 * auVar73._0_4_;
      auVar164._4_4_ = fVar125 * auVar73._4_4_;
      auVar164._8_4_ = fVar141 * auVar73._8_4_;
      auVar164._12_4_ = fVar132 * auVar73._12_4_;
      auVar74 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar4,auVar74);
      auVar73 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar3,auVar79);
      auVar74 = vsubps_avx512vl(_local_390,auVar75);
      uVar126 = auVar74._0_4_;
      auVar137._4_4_ = uVar126;
      auVar137._0_4_ = uVar126;
      auVar137._8_4_ = uVar126;
      auVar137._12_4_ = uVar126;
      auVar75 = vshufps_avx(auVar74,auVar74,0x55);
      auVar74 = vshufps_avx(auVar74,auVar74,0xaa);
      auVar165._0_4_ = fVar133 * auVar74._0_4_;
      auVar165._4_4_ = fVar125 * auVar74._4_4_;
      auVar165._8_4_ = fVar141 * auVar74._8_4_;
      auVar165._12_4_ = fVar132 * auVar74._12_4_;
      auVar75 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar4,auVar75);
      auVar74 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar3,auVar137);
      lVar19 = (long)iVar10 * 0x44;
      auVar86 = *(undefined1 (*) [32])(bezier_basis0 + lVar19);
      local_3c0 = vbroadcastss_avx512vl(auVar5);
      auVar131._8_4_ = 1;
      auVar131._0_8_ = 0x100000001;
      auVar131._12_4_ = 1;
      auVar131._16_4_ = 1;
      auVar131._20_4_ = 1;
      auVar131._24_4_ = 1;
      auVar131._28_4_ = 1;
      local_400 = vpermps_avx2(auVar131,ZEXT1632(auVar5));
      auVar83 = *(undefined1 (*) [32])(bezier_basis0 + lVar19 + 0x484);
      uVar126 = auVar6._0_4_;
      local_420._4_4_ = uVar126;
      local_420._0_4_ = uVar126;
      local_420._8_4_ = uVar126;
      local_420._12_4_ = uVar126;
      local_420._16_4_ = uVar126;
      local_420._20_4_ = uVar126;
      local_420._24_4_ = uVar126;
      local_420._28_4_ = uVar126;
      local_440 = vpermps_avx512vl(auVar131,ZEXT1632(auVar6));
      auVar84 = *(undefined1 (*) [32])(bezier_basis0 + lVar19 + 0x908);
      local_560 = vbroadcastss_avx512vl(auVar73);
      local_4c0 = vpermps_avx512vl(auVar131,ZEXT1632(auVar73));
      auVar181 = ZEXT3264(local_4c0);
      auVar85 = *(undefined1 (*) [32])(bezier_basis0 + lVar19 + 0xd8c);
      local_4e0 = vbroadcastss_avx512vl(auVar74);
      auVar184 = ZEXT3264(local_4e0);
      local_500 = vpermps_avx512vl(auVar131,ZEXT1632(auVar74));
      auVar182 = ZEXT3264(local_500);
      auVar88 = vmulps_avx512vl(local_4e0,auVar85);
      auVar87 = vmulps_avx512vl(local_500,auVar85);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar84,local_560);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar84,local_4c0);
      auVar75 = vfmadd231ps_fma(auVar88,auVar83,local_420);
      auVar88 = vfmadd231ps_avx512vl(auVar87,auVar83,local_440);
      auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar86,local_3c0);
      auVar90 = vfmadd231ps_avx512vl(auVar88,auVar86,local_400);
      auVar88 = *(undefined1 (*) [32])(bezier_basis1 + lVar19);
      auVar87 = *(undefined1 (*) [32])(bezier_basis1 + lVar19 + 0x484);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar19 + 0x908);
      auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar19 + 0xd8c);
      auVar82 = vmulps_avx512vl(local_4e0,auVar95);
      auVar91 = vmulps_avx512vl(local_500,auVar95);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar96,local_560);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar96,local_4c0);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar87,local_420);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar87,local_440);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar88,local_3c0);
      auVar7 = vfmadd231ps_fma(auVar91,auVar88,local_400);
      auVar91 = vsubps_avx512vl(auVar82,auVar89);
      auVar92 = vsubps_avx512vl(ZEXT1632(auVar7),auVar90);
      auVar80 = vmulps_avx512vl(auVar90,auVar91);
      auVar81 = vmulps_avx512vl(auVar89,auVar92);
      auVar80 = vsubps_avx512vl(auVar80,auVar81);
      auVar75 = vshufps_avx(local_510,local_510,0xff);
      uVar134 = auVar77._0_8_;
      local_a0._8_8_ = uVar134;
      local_a0._0_8_ = uVar134;
      local_a0._16_8_ = uVar134;
      local_a0._24_8_ = uVar134;
      local_c0 = vbroadcastsd_avx512vl(auVar75);
      auVar75 = vshufps_avx512vl(local_520,local_520,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar75);
      auVar75 = vshufps_avx512vl(_local_390,_local_390,0xff);
      uVar134 = auVar75._0_8_;
      register0x000012c8 = uVar134;
      local_100 = uVar134;
      register0x000012d0 = uVar134;
      register0x000012d8 = uVar134;
      auVar81 = vmulps_avx512vl(_local_100,auVar85);
      auVar81 = vfmadd231ps_avx512vl(auVar81,auVar84,local_e0);
      auVar81 = vfmadd231ps_avx512vl(auVar81,auVar83,local_c0);
      auVar81 = vfmadd231ps_avx512vl(auVar81,auVar86,local_a0);
      auVar93 = vmulps_avx512vl(_local_100,auVar95);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar96,local_e0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar87,local_c0);
      auVar8 = vfmadd231ps_fma(auVar93,auVar88,local_a0);
      auVar93 = vmulps_avx512vl(auVar92,auVar92);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar91,auVar91);
      auVar94 = vmaxps_avx512vl(auVar81,ZEXT1632(auVar8));
      auVar94 = vmulps_avx512vl(auVar94,auVar94);
      auVar93 = vmulps_avx512vl(auVar94,auVar93);
      auVar80 = vmulps_avx512vl(auVar80,auVar80);
      uVar134 = vcmpps_avx512vl(auVar80,auVar93,2);
      auVar75 = vblendps_avx(auVar5,local_5d0,8);
      auVar76 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar77 = vandps_avx512vl(auVar75,auVar76);
      auVar75 = vblendps_avx(auVar6,local_510,8);
      auVar75 = vandps_avx512vl(auVar75,auVar76);
      auVar77 = vmaxps_avx(auVar77,auVar75);
      auVar75 = vblendps_avx(auVar73,local_520,8);
      auVar78 = vandps_avx512vl(auVar75,auVar76);
      auVar75 = vblendps_avx(auVar74,_local_390,8);
      auVar75 = vandps_avx512vl(auVar75,auVar76);
      auVar75 = vmaxps_avx(auVar78,auVar75);
      auVar75 = vmaxps_avx(auVar77,auVar75);
      auVar77 = vmovshdup_avx(auVar75);
      auVar77 = vmaxss_avx(auVar77,auVar75);
      auVar75 = vshufpd_avx(auVar75,auVar75,1);
      auVar75 = vmaxss_avx(auVar75,auVar77);
      local_540 = vcvtsi2ss_avx512f(local_520,iVar10);
      auVar166._0_4_ = local_540._0_4_;
      auVar166._4_4_ = auVar166._0_4_;
      auVar166._8_4_ = auVar166._0_4_;
      auVar166._12_4_ = auVar166._0_4_;
      auVar166._16_4_ = auVar166._0_4_;
      auVar166._20_4_ = auVar166._0_4_;
      auVar166._24_4_ = auVar166._0_4_;
      auVar166._28_4_ = auVar166._0_4_;
      uVar18 = vcmpps_avx512vl(auVar166,_DAT_01faff40,0xe);
      bVar70 = (byte)uVar134 & (byte)uVar18;
      fVar125 = auVar75._0_4_ * 4.7683716e-07;
      auVar139._8_4_ = 2;
      auVar139._0_8_ = 0x200000002;
      auVar139._12_4_ = 2;
      auVar139._16_4_ = 2;
      auVar139._20_4_ = 2;
      auVar139._24_4_ = 2;
      auVar139._28_4_ = 2;
      local_120 = vpermps_avx512vl(auVar139,ZEXT1632(auVar5));
      local_140 = vpermps_avx512vl(auVar139,ZEXT1632(auVar6));
      local_160 = vpermps_avx512vl(auVar139,ZEXT1632(auVar73));
      local_4a0 = vpermps_avx2(auVar139,ZEXT1632(auVar74));
      fVar133 = *(float *)(ray + k * 4 + 0x30);
      auVar75 = auVar92._0_16_;
      if (bVar70 == 0) {
        uVar64 = 0;
        auVar75 = vxorps_avx512vl(auVar75,auVar75);
        auVar180 = ZEXT1664(auVar75);
        auVar177 = ZEXT3264(local_3c0);
        auVar178 = ZEXT3264(local_400);
        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar183 = ZEXT3264(auVar86);
        auVar179 = ZEXT3264(local_420);
        auVar175 = ZEXT3264(local_440);
        auVar176 = ZEXT3264(local_560);
      }
      else {
        fStack_47c = 0.0;
        fStack_478 = 0.0;
        fStack_474 = 0.0;
        auVar95 = vmulps_avx512vl(local_4a0,auVar95);
        auVar96 = vfmadd213ps_avx512vl(auVar96,local_160,auVar95);
        auVar87 = vfmadd213ps_avx512vl(auVar87,local_140,auVar96);
        auVar87 = vfmadd213ps_avx512vl(auVar88,local_120,auVar87);
        auVar85 = vmulps_avx512vl(local_4a0,auVar85);
        auVar84 = vfmadd213ps_avx512vl(auVar84,local_160,auVar85);
        auVar96 = vfmadd213ps_avx512vl(auVar83,local_140,auVar84);
        auVar83 = *(undefined1 (*) [32])(bezier_basis0 + lVar19 + 0x1210);
        auVar84 = *(undefined1 (*) [32])(bezier_basis0 + lVar19 + 0x1694);
        auVar85 = *(undefined1 (*) [32])(bezier_basis0 + lVar19 + 0x1b18);
        auVar88 = *(undefined1 (*) [32])(bezier_basis0 + lVar19 + 0x1f9c);
        auVar96 = vfmadd213ps_avx512vl(auVar86,local_120,auVar96);
        auVar86 = vmulps_avx512vl(local_4e0,auVar88);
        auVar95 = vmulps_avx512vl(local_500,auVar88);
        auVar88 = vmulps_avx512vl(local_4a0,auVar88);
        auVar176 = ZEXT3264(local_560);
        auVar86 = vfmadd231ps_avx512vl(auVar86,auVar85,local_560);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar85,local_4c0);
        auVar85 = vfmadd231ps_avx512vl(auVar88,local_160,auVar85);
        auVar86 = vfmadd231ps_avx512vl(auVar86,auVar84,local_420);
        auVar88 = vfmadd231ps_avx512vl(auVar95,auVar84,local_440);
        auVar95 = vfmadd231ps_avx512vl(auVar85,local_140,auVar84);
        auVar77 = vfmadd231ps_fma(auVar86,auVar83,local_3c0);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar83,local_400);
        auVar86 = *(undefined1 (*) [32])(bezier_basis1 + lVar19 + 0x1210);
        auVar84 = *(undefined1 (*) [32])(bezier_basis1 + lVar19 + 0x1b18);
        auVar85 = *(undefined1 (*) [32])(bezier_basis1 + lVar19 + 0x1f9c);
        auVar95 = vfmadd231ps_avx512vl(auVar95,local_120,auVar83);
        auVar83 = vmulps_avx512vl(local_4e0,auVar85);
        auVar80 = vmulps_avx512vl(local_500,auVar85);
        auVar85 = vmulps_avx512vl(local_4a0,auVar85);
        auVar93 = vfmadd231ps_avx512vl(auVar83,auVar84,local_560);
        auVar80 = vfmadd231ps_avx512vl(auVar80,auVar84,local_4c0);
        auVar84 = vfmadd231ps_avx512vl(auVar85,local_160,auVar84);
        auVar83 = *(undefined1 (*) [32])(bezier_basis1 + lVar19 + 0x1694);
        auVar85 = vfmadd231ps_avx512vl(auVar93,auVar83,local_420);
        auVar80 = vfmadd231ps_avx512vl(auVar80,auVar83,local_440);
        auVar83 = vfmadd231ps_avx512vl(auVar84,local_140,auVar83);
        auVar74 = vfmadd231ps_fma(auVar85,auVar86,local_3c0);
        auVar84 = vfmadd231ps_avx512vl(auVar80,auVar86,local_400);
        auVar85 = vfmadd231ps_avx512vl(auVar83,local_120,auVar86);
        auVar173._8_4_ = 0x7fffffff;
        auVar173._0_8_ = 0x7fffffff7fffffff;
        auVar173._12_4_ = 0x7fffffff;
        auVar173._16_4_ = 0x7fffffff;
        auVar173._20_4_ = 0x7fffffff;
        auVar173._24_4_ = 0x7fffffff;
        auVar173._28_4_ = 0x7fffffff;
        auVar86 = vandps_avx(ZEXT1632(auVar77),auVar173);
        auVar83 = vandps_avx(auVar88,auVar173);
        auVar83 = vmaxps_avx(auVar86,auVar83);
        auVar86 = vandps_avx(auVar95,auVar173);
        auVar86 = vmaxps_avx(auVar83,auVar86);
        auVar95 = vbroadcastss_avx512vl(ZEXT416((uint)fVar125));
        uVar64 = vcmpps_avx512vl(auVar86,auVar95,1);
        bVar12 = (bool)((byte)uVar64 & 1);
        auVar97._0_4_ = (float)((uint)bVar12 * auVar91._0_4_ | (uint)!bVar12 * auVar77._0_4_);
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar97._4_4_ = (float)((uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar77._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar97._8_4_ = (float)((uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar77._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar97._12_4_ = (float)((uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar77._12_4_);
        fVar132 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar91._16_4_);
        auVar97._16_4_ = fVar132;
        fVar141 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar91._20_4_);
        auVar97._20_4_ = fVar141;
        fVar154 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar91._24_4_);
        auVar97._24_4_ = fVar154;
        uVar65 = (uint)(byte)(uVar64 >> 7) * auVar91._28_4_;
        auVar97._28_4_ = uVar65;
        bVar12 = (bool)((byte)uVar64 & 1);
        auVar98._0_4_ = (float)((uint)bVar12 * auVar92._0_4_ | (uint)!bVar12 * auVar88._0_4_);
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar98._4_4_ = (float)((uint)bVar12 * auVar92._4_4_ | (uint)!bVar12 * auVar88._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar98._8_4_ = (float)((uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar88._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar98._12_4_ = (float)((uint)bVar12 * auVar92._12_4_ | (uint)!bVar12 * auVar88._12_4_);
        bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar98._16_4_ = (float)((uint)bVar12 * auVar92._16_4_ | (uint)!bVar12 * auVar88._16_4_);
        bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar98._20_4_ = (float)((uint)bVar12 * auVar92._20_4_ | (uint)!bVar12 * auVar88._20_4_);
        bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar98._24_4_ = (float)((uint)bVar12 * auVar92._24_4_ | (uint)!bVar12 * auVar88._24_4_);
        bVar12 = SUB81(uVar64 >> 7,0);
        auVar98._28_4_ = (uint)bVar12 * auVar92._28_4_ | (uint)!bVar12 * auVar88._28_4_;
        auVar86 = vandps_avx(auVar173,ZEXT1632(auVar74));
        auVar83 = vandps_avx(auVar84,auVar173);
        auVar83 = vmaxps_avx(auVar86,auVar83);
        auVar86 = vandps_avx(auVar85,auVar173);
        auVar86 = vmaxps_avx(auVar83,auVar86);
        uVar64 = vcmpps_avx512vl(auVar86,auVar95,1);
        bVar12 = (bool)((byte)uVar64 & 1);
        auVar99._0_4_ = (float)((uint)bVar12 * auVar91._0_4_ | (uint)!bVar12 * auVar74._0_4_);
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar99._4_4_ = (float)((uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar74._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar99._8_4_ = (float)((uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar74._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar99._12_4_ = (float)((uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar74._12_4_);
        fVar157 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar91._16_4_);
        auVar99._16_4_ = fVar157;
        fVar153 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar91._20_4_);
        auVar99._20_4_ = fVar153;
        fVar156 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar91._24_4_);
        auVar99._24_4_ = fVar156;
        auVar99._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar91._28_4_;
        bVar12 = (bool)((byte)uVar64 & 1);
        auVar100._0_4_ = (float)((uint)bVar12 * auVar92._0_4_ | (uint)!bVar12 * auVar84._0_4_);
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar100._4_4_ = (float)((uint)bVar12 * auVar92._4_4_ | (uint)!bVar12 * auVar84._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar100._8_4_ = (float)((uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar84._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar100._12_4_ = (float)((uint)bVar12 * auVar92._12_4_ | (uint)!bVar12 * auVar84._12_4_);
        bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar100._16_4_ = (float)((uint)bVar12 * auVar92._16_4_ | (uint)!bVar12 * auVar84._16_4_);
        bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar100._20_4_ = (float)((uint)bVar12 * auVar92._20_4_ | (uint)!bVar12 * auVar84._20_4_);
        bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar100._24_4_ = (float)((uint)bVar12 * auVar92._24_4_ | (uint)!bVar12 * auVar84._24_4_);
        bVar12 = SUB81(uVar64 >> 7,0);
        auVar100._28_4_ = (uint)bVar12 * auVar92._28_4_ | (uint)!bVar12 * auVar84._28_4_;
        auVar79 = vxorps_avx512vl(auVar75,auVar75);
        auVar180 = ZEXT1664(auVar79);
        auVar86 = vfmadd213ps_avx512vl(auVar97,auVar97,ZEXT1632(auVar79));
        auVar75 = vfmadd231ps_fma(auVar86,auVar98,auVar98);
        auVar86 = vrsqrt14ps_avx512vl(ZEXT1632(auVar75));
        fVar140 = auVar86._0_4_;
        fVar72 = auVar86._4_4_;
        fVar118 = auVar86._8_4_;
        fVar119 = auVar86._12_4_;
        fVar120 = auVar86._16_4_;
        fVar121 = auVar86._20_4_;
        fVar122 = auVar86._24_4_;
        auVar26._4_4_ = fVar72 * fVar72 * fVar72 * auVar75._4_4_ * -0.5;
        auVar26._0_4_ = fVar140 * fVar140 * fVar140 * auVar75._0_4_ * -0.5;
        auVar26._8_4_ = fVar118 * fVar118 * fVar118 * auVar75._8_4_ * -0.5;
        auVar26._12_4_ = fVar119 * fVar119 * fVar119 * auVar75._12_4_ * -0.5;
        auVar26._16_4_ = fVar120 * fVar120 * fVar120 * -0.0;
        auVar26._20_4_ = fVar121 * fVar121 * fVar121 * -0.0;
        auVar26._24_4_ = fVar122 * fVar122 * fVar122 * -0.0;
        auVar26._28_4_ = 0;
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar84 = vfmadd231ps_avx512vl(auVar26,auVar83,auVar86);
        auVar27._4_4_ = auVar98._4_4_ * auVar84._4_4_;
        auVar27._0_4_ = auVar98._0_4_ * auVar84._0_4_;
        auVar27._8_4_ = auVar98._8_4_ * auVar84._8_4_;
        auVar27._12_4_ = auVar98._12_4_ * auVar84._12_4_;
        auVar27._16_4_ = auVar98._16_4_ * auVar84._16_4_;
        auVar27._20_4_ = auVar98._20_4_ * auVar84._20_4_;
        auVar27._24_4_ = auVar98._24_4_ * auVar84._24_4_;
        auVar27._28_4_ = auVar86._28_4_;
        auVar28._4_4_ = auVar84._4_4_ * -auVar97._4_4_;
        auVar28._0_4_ = auVar84._0_4_ * -auVar97._0_4_;
        auVar28._8_4_ = auVar84._8_4_ * -auVar97._8_4_;
        auVar28._12_4_ = auVar84._12_4_ * -auVar97._12_4_;
        auVar28._16_4_ = auVar84._16_4_ * -fVar132;
        auVar28._20_4_ = auVar84._20_4_ * -fVar141;
        auVar28._24_4_ = auVar84._24_4_ * -fVar154;
        auVar28._28_4_ = uVar65 ^ 0x80000000;
        auVar86 = vmulps_avx512vl(auVar84,ZEXT1632(auVar79));
        auVar91 = ZEXT1632(auVar79);
        auVar85 = vfmadd213ps_avx512vl(auVar99,auVar99,auVar91);
        auVar75 = vfmadd231ps_fma(auVar85,auVar100,auVar100);
        auVar85 = vrsqrt14ps_avx512vl(ZEXT1632(auVar75));
        fVar141 = auVar85._0_4_;
        fVar132 = auVar85._4_4_;
        fVar154 = auVar85._8_4_;
        fVar140 = auVar85._12_4_;
        fVar72 = auVar85._16_4_;
        fVar118 = auVar85._20_4_;
        fVar119 = auVar85._24_4_;
        auVar29._4_4_ = fVar132 * fVar132 * fVar132 * auVar75._4_4_ * -0.5;
        auVar29._0_4_ = fVar141 * fVar141 * fVar141 * auVar75._0_4_ * -0.5;
        auVar29._8_4_ = fVar154 * fVar154 * fVar154 * auVar75._8_4_ * -0.5;
        auVar29._12_4_ = fVar140 * fVar140 * fVar140 * auVar75._12_4_ * -0.5;
        auVar29._16_4_ = fVar72 * fVar72 * fVar72 * -0.0;
        auVar29._20_4_ = fVar118 * fVar118 * fVar118 * -0.0;
        auVar29._24_4_ = fVar119 * fVar119 * fVar119 * -0.0;
        auVar29._28_4_ = 0;
        auVar83 = vfmadd231ps_avx512vl(auVar29,auVar83,auVar85);
        auVar30._4_4_ = auVar100._4_4_ * auVar83._4_4_;
        auVar30._0_4_ = auVar100._0_4_ * auVar83._0_4_;
        auVar30._8_4_ = auVar100._8_4_ * auVar83._8_4_;
        auVar30._12_4_ = auVar100._12_4_ * auVar83._12_4_;
        auVar30._16_4_ = auVar100._16_4_ * auVar83._16_4_;
        auVar30._20_4_ = auVar100._20_4_ * auVar83._20_4_;
        auVar30._24_4_ = auVar100._24_4_ * auVar83._24_4_;
        auVar30._28_4_ = auVar85._28_4_;
        auVar31._4_4_ = -auVar99._4_4_ * auVar83._4_4_;
        auVar31._0_4_ = -auVar99._0_4_ * auVar83._0_4_;
        auVar31._8_4_ = -auVar99._8_4_ * auVar83._8_4_;
        auVar31._12_4_ = -auVar99._12_4_ * auVar83._12_4_;
        auVar31._16_4_ = -fVar157 * auVar83._16_4_;
        auVar31._20_4_ = -fVar153 * auVar83._20_4_;
        auVar31._24_4_ = -fVar156 * auVar83._24_4_;
        auVar31._28_4_ = auVar84._28_4_;
        auVar83 = vmulps_avx512vl(auVar83,auVar91);
        auVar75 = vfmadd213ps_fma(auVar27,auVar81,auVar89);
        auVar77 = vfmadd213ps_fma(auVar28,auVar81,auVar90);
        auVar84 = vfmadd213ps_avx512vl(auVar86,auVar81,auVar96);
        auVar85 = vfmadd213ps_avx512vl(auVar30,ZEXT1632(auVar8),auVar82);
        auVar76 = vfnmadd213ps_fma(auVar27,auVar81,auVar89);
        auVar95 = ZEXT1632(auVar8);
        auVar74 = vfmadd213ps_fma(auVar31,auVar95,ZEXT1632(auVar7));
        auVar78 = vfnmadd213ps_fma(auVar28,auVar81,auVar90);
        auVar73 = vfmadd213ps_fma(auVar83,auVar95,auVar87);
        auVar88 = vfnmadd231ps_avx512vl(auVar96,auVar81,auVar86);
        auVar137 = vfnmadd213ps_fma(auVar30,auVar95,auVar82);
        auVar7 = vfnmadd213ps_fma(auVar31,auVar95,ZEXT1632(auVar7));
        auVar142 = vfnmadd231ps_fma(auVar87,ZEXT1632(auVar8),auVar83);
        auVar83 = vsubps_avx512vl(auVar85,ZEXT1632(auVar76));
        auVar86 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar78));
        auVar87 = vsubps_avx512vl(ZEXT1632(auVar73),auVar88);
        auVar96 = vmulps_avx512vl(auVar86,auVar88);
        auVar5 = vfmsub231ps_fma(auVar96,ZEXT1632(auVar78),auVar87);
        auVar32._4_4_ = auVar76._4_4_ * auVar87._4_4_;
        auVar32._0_4_ = auVar76._0_4_ * auVar87._0_4_;
        auVar32._8_4_ = auVar76._8_4_ * auVar87._8_4_;
        auVar32._12_4_ = auVar76._12_4_ * auVar87._12_4_;
        auVar32._16_4_ = auVar87._16_4_ * 0.0;
        auVar32._20_4_ = auVar87._20_4_ * 0.0;
        auVar32._24_4_ = auVar87._24_4_ * 0.0;
        auVar32._28_4_ = auVar87._28_4_;
        auVar87 = vfmsub231ps_avx512vl(auVar32,auVar88,auVar83);
        auVar33._4_4_ = auVar78._4_4_ * auVar83._4_4_;
        auVar33._0_4_ = auVar78._0_4_ * auVar83._0_4_;
        auVar33._8_4_ = auVar78._8_4_ * auVar83._8_4_;
        auVar33._12_4_ = auVar78._12_4_ * auVar83._12_4_;
        auVar33._16_4_ = auVar83._16_4_ * 0.0;
        auVar33._20_4_ = auVar83._20_4_ * 0.0;
        auVar33._24_4_ = auVar83._24_4_ * 0.0;
        auVar33._28_4_ = auVar83._28_4_;
        auVar6 = vfmsub231ps_fma(auVar33,ZEXT1632(auVar76),auVar86);
        auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar6),auVar91,auVar87);
        auVar86 = vfmadd231ps_avx512vl(auVar86,auVar91,ZEXT1632(auVar5));
        auVar92 = ZEXT1632(auVar79);
        uVar64 = vcmpps_avx512vl(auVar86,auVar92,2);
        bVar63 = (byte)uVar64;
        fVar140 = (float)((uint)(bVar63 & 1) * auVar75._0_4_ |
                         (uint)!(bool)(bVar63 & 1) * auVar137._0_4_);
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        fVar118 = (float)((uint)bVar12 * auVar75._4_4_ | (uint)!bVar12 * auVar137._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        fVar120 = (float)((uint)bVar12 * auVar75._8_4_ | (uint)!bVar12 * auVar137._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        fVar122 = (float)((uint)bVar12 * auVar75._12_4_ | (uint)!bVar12 * auVar137._12_4_);
        auVar96 = ZEXT1632(CONCAT412(fVar122,CONCAT48(fVar120,CONCAT44(fVar118,fVar140))));
        fVar72 = (float)((uint)(bVar63 & 1) * auVar77._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar7._0_4_);
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        fVar119 = (float)((uint)bVar12 * auVar77._4_4_ | (uint)!bVar12 * auVar7._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        fVar121 = (float)((uint)bVar12 * auVar77._8_4_ | (uint)!bVar12 * auVar7._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        fVar123 = (float)((uint)bVar12 * auVar77._12_4_ | (uint)!bVar12 * auVar7._12_4_);
        auVar95 = ZEXT1632(CONCAT412(fVar123,CONCAT48(fVar121,CONCAT44(fVar119,fVar72))));
        auVar101._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar142._0_4_
                    );
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar12 * auVar84._4_4_ | (uint)!bVar12 * auVar142._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar12 * auVar84._8_4_ | (uint)!bVar12 * auVar142._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar12 * auVar84._12_4_ | (uint)!bVar12 * auVar142._12_4_);
        fVar132 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar84._16_4_);
        auVar101._16_4_ = fVar132;
        fVar154 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar84._20_4_);
        auVar101._20_4_ = fVar154;
        fVar141 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar84._24_4_);
        auVar101._24_4_ = fVar141;
        iVar1 = (uint)(byte)(uVar64 >> 7) * auVar84._28_4_;
        auVar101._28_4_ = iVar1;
        auVar83 = vblendmps_avx512vl(ZEXT1632(auVar76),auVar85);
        auVar102._0_4_ =
             (uint)(bVar63 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar5._0_4_;
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar102._4_4_ = (uint)bVar12 * auVar83._4_4_ | (uint)!bVar12 * auVar5._4_4_;
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar102._8_4_ = (uint)bVar12 * auVar83._8_4_ | (uint)!bVar12 * auVar5._8_4_;
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar102._12_4_ = (uint)bVar12 * auVar83._12_4_ | (uint)!bVar12 * auVar5._12_4_;
        auVar102._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar83._16_4_;
        auVar102._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar83._20_4_;
        auVar102._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar83._24_4_;
        auVar102._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar83._28_4_;
        auVar83 = vblendmps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar74));
        auVar103._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar77._0_4_)
        ;
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar12 * auVar83._4_4_ | (uint)!bVar12 * auVar77._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar12 * auVar83._8_4_ | (uint)!bVar12 * auVar77._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar12 * auVar83._12_4_ | (uint)!bVar12 * auVar77._12_4_);
        fVar157 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar83._16_4_);
        auVar103._16_4_ = fVar157;
        fVar153 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar83._20_4_);
        auVar103._20_4_ = fVar153;
        fVar156 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar83._24_4_);
        auVar103._24_4_ = fVar156;
        auVar103._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar83._28_4_;
        auVar83 = vblendmps_avx512vl(auVar88,ZEXT1632(auVar73));
        auVar104._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar84._0_4_)
        ;
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar12 * auVar83._4_4_ | (uint)!bVar12 * auVar84._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar12 * auVar83._8_4_ | (uint)!bVar12 * auVar84._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar12 * auVar83._12_4_ | (uint)!bVar12 * auVar84._12_4_);
        bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar12 * auVar83._16_4_ | (uint)!bVar12 * auVar84._16_4_);
        bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar12 * auVar83._20_4_ | (uint)!bVar12 * auVar84._20_4_);
        bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar12 * auVar83._24_4_ | (uint)!bVar12 * auVar84._24_4_);
        bVar12 = SUB81(uVar64 >> 7,0);
        auVar104._28_4_ = (uint)bVar12 * auVar83._28_4_ | (uint)!bVar12 * auVar84._28_4_;
        auVar105._0_4_ =
             (uint)(bVar63 & 1) * (int)auVar76._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar85._0_4_;
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar105._4_4_ = (uint)bVar12 * (int)auVar76._4_4_ | (uint)!bVar12 * auVar85._4_4_;
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar105._8_4_ = (uint)bVar12 * (int)auVar76._8_4_ | (uint)!bVar12 * auVar85._8_4_;
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar105._12_4_ = (uint)bVar12 * (int)auVar76._12_4_ | (uint)!bVar12 * auVar85._12_4_;
        auVar105._16_4_ = (uint)!(bool)((byte)(uVar64 >> 4) & 1) * auVar85._16_4_;
        auVar105._20_4_ = (uint)!(bool)((byte)(uVar64 >> 5) & 1) * auVar85._20_4_;
        auVar105._24_4_ = (uint)!(bool)((byte)(uVar64 >> 6) & 1) * auVar85._24_4_;
        auVar105._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar85._28_4_;
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar106._0_4_ =
             (uint)(bVar63 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar73._0_4_;
        bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar106._4_4_ = (uint)bVar13 * auVar88._4_4_ | (uint)!bVar13 * auVar73._4_4_;
        bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar106._8_4_ = (uint)bVar13 * auVar88._8_4_ | (uint)!bVar13 * auVar73._8_4_;
        bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar106._12_4_ = (uint)bVar13 * auVar88._12_4_ | (uint)!bVar13 * auVar73._12_4_;
        auVar106._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar88._16_4_;
        auVar106._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar88._20_4_;
        auVar106._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar88._24_4_;
        iVar2 = (uint)(byte)(uVar64 >> 7) * auVar88._28_4_;
        auVar106._28_4_ = iVar2;
        auVar89 = vsubps_avx512vl(auVar105,auVar96);
        auVar83 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar78._12_4_ |
                                                (uint)!bVar15 * auVar74._12_4_,
                                                CONCAT48((uint)bVar14 * (int)auVar78._8_4_ |
                                                         (uint)!bVar14 * auVar74._8_4_,
                                                         CONCAT44((uint)bVar12 * (int)auVar78._4_4_
                                                                  | (uint)!bVar12 * auVar74._4_4_,
                                                                  (uint)(bVar63 & 1) *
                                                                  (int)auVar78._0_4_ |
                                                                  (uint)!(bool)(bVar63 & 1) *
                                                                  auVar74._0_4_)))),auVar95);
        auVar84 = vsubps_avx(auVar106,auVar101);
        auVar85 = vsubps_avx(auVar96,auVar102);
        auVar88 = vsubps_avx(auVar95,auVar103);
        auVar87 = vsubps_avx(auVar101,auVar104);
        auVar34._4_4_ = auVar84._4_4_ * fVar118;
        auVar34._0_4_ = auVar84._0_4_ * fVar140;
        auVar34._8_4_ = auVar84._8_4_ * fVar120;
        auVar34._12_4_ = auVar84._12_4_ * fVar122;
        auVar34._16_4_ = auVar84._16_4_ * 0.0;
        auVar34._20_4_ = auVar84._20_4_ * 0.0;
        auVar34._24_4_ = auVar84._24_4_ * 0.0;
        auVar34._28_4_ = iVar2;
        auVar75 = vfmsub231ps_fma(auVar34,auVar101,auVar89);
        auVar35._4_4_ = fVar119 * auVar89._4_4_;
        auVar35._0_4_ = fVar72 * auVar89._0_4_;
        auVar35._8_4_ = fVar121 * auVar89._8_4_;
        auVar35._12_4_ = fVar123 * auVar89._12_4_;
        auVar35._16_4_ = auVar89._16_4_ * 0.0;
        auVar35._20_4_ = auVar89._20_4_ * 0.0;
        auVar35._24_4_ = auVar89._24_4_ * 0.0;
        auVar35._28_4_ = auVar86._28_4_;
        auVar77 = vfmsub231ps_fma(auVar35,auVar96,auVar83);
        auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar92,ZEXT1632(auVar75));
        auVar147._0_4_ = auVar83._0_4_ * auVar101._0_4_;
        auVar147._4_4_ = auVar83._4_4_ * auVar101._4_4_;
        auVar147._8_4_ = auVar83._8_4_ * auVar101._8_4_;
        auVar147._12_4_ = auVar83._12_4_ * auVar101._12_4_;
        auVar147._16_4_ = auVar83._16_4_ * fVar132;
        auVar147._20_4_ = auVar83._20_4_ * fVar154;
        auVar147._24_4_ = auVar83._24_4_ * fVar141;
        auVar147._28_4_ = 0;
        auVar75 = vfmsub231ps_fma(auVar147,auVar95,auVar84);
        auVar90 = vfmadd231ps_avx512vl(auVar86,auVar92,ZEXT1632(auVar75));
        auVar86 = vmulps_avx512vl(auVar87,auVar102);
        auVar86 = vfmsub231ps_avx512vl(auVar86,auVar85,auVar104);
        auVar36._4_4_ = auVar88._4_4_ * auVar104._4_4_;
        auVar36._0_4_ = auVar88._0_4_ * auVar104._0_4_;
        auVar36._8_4_ = auVar88._8_4_ * auVar104._8_4_;
        auVar36._12_4_ = auVar88._12_4_ * auVar104._12_4_;
        auVar36._16_4_ = auVar88._16_4_ * auVar104._16_4_;
        auVar36._20_4_ = auVar88._20_4_ * auVar104._20_4_;
        auVar36._24_4_ = auVar88._24_4_ * auVar104._24_4_;
        auVar36._28_4_ = auVar104._28_4_;
        auVar75 = vfmsub231ps_fma(auVar36,auVar103,auVar87);
        auVar148._0_4_ = auVar103._0_4_ * auVar85._0_4_;
        auVar148._4_4_ = auVar103._4_4_ * auVar85._4_4_;
        auVar148._8_4_ = auVar103._8_4_ * auVar85._8_4_;
        auVar148._12_4_ = auVar103._12_4_ * auVar85._12_4_;
        auVar148._16_4_ = fVar157 * auVar85._16_4_;
        auVar148._20_4_ = fVar153 * auVar85._20_4_;
        auVar148._24_4_ = fVar156 * auVar85._24_4_;
        auVar148._28_4_ = 0;
        auVar77 = vfmsub231ps_fma(auVar148,auVar88,auVar102);
        auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar92,auVar86);
        auVar82 = vfmadd231ps_avx512vl(auVar86,auVar92,ZEXT1632(auVar75));
        auVar86 = vmaxps_avx(auVar90,auVar82);
        uVar134 = vcmpps_avx512vl(auVar86,auVar92,2);
        bVar70 = bVar70 & (byte)uVar134;
        auVar177 = ZEXT3264(local_3c0);
        auVar178 = ZEXT3264(local_400);
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar183 = ZEXT3264(auVar91);
        auVar179 = ZEXT3264(local_420);
        auVar175 = ZEXT3264(local_440);
        if (bVar70 == 0) {
          uVar64 = 0;
          auVar181 = ZEXT3264(local_4c0);
          auVar184 = ZEXT3264(local_4e0);
          auVar182 = ZEXT3264(local_500);
        }
        else {
          uVar126 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar169._4_4_ = uVar126;
          auVar169._0_4_ = uVar126;
          auVar169._8_4_ = uVar126;
          auVar169._12_4_ = uVar126;
          auVar169._16_4_ = uVar126;
          auVar169._20_4_ = uVar126;
          auVar169._24_4_ = uVar126;
          auVar169._28_4_ = uVar126;
          auVar171 = ZEXT3264(auVar169);
          auVar37._4_4_ = auVar87._4_4_ * auVar83._4_4_;
          auVar37._0_4_ = auVar87._0_4_ * auVar83._0_4_;
          auVar37._8_4_ = auVar87._8_4_ * auVar83._8_4_;
          auVar37._12_4_ = auVar87._12_4_ * auVar83._12_4_;
          auVar37._16_4_ = auVar87._16_4_ * auVar83._16_4_;
          auVar37._20_4_ = auVar87._20_4_ * auVar83._20_4_;
          auVar37._24_4_ = auVar87._24_4_ * auVar83._24_4_;
          auVar37._28_4_ = auVar86._28_4_;
          auVar74 = vfmsub231ps_fma(auVar37,auVar88,auVar84);
          auVar38._4_4_ = auVar84._4_4_ * auVar85._4_4_;
          auVar38._0_4_ = auVar84._0_4_ * auVar85._0_4_;
          auVar38._8_4_ = auVar84._8_4_ * auVar85._8_4_;
          auVar38._12_4_ = auVar84._12_4_ * auVar85._12_4_;
          auVar38._16_4_ = auVar84._16_4_ * auVar85._16_4_;
          auVar38._20_4_ = auVar84._20_4_ * auVar85._20_4_;
          auVar38._24_4_ = auVar84._24_4_ * auVar85._24_4_;
          auVar38._28_4_ = auVar84._28_4_;
          auVar77 = vfmsub231ps_fma(auVar38,auVar89,auVar87);
          auVar39._4_4_ = auVar88._4_4_ * auVar89._4_4_;
          auVar39._0_4_ = auVar88._0_4_ * auVar89._0_4_;
          auVar39._8_4_ = auVar88._8_4_ * auVar89._8_4_;
          auVar39._12_4_ = auVar88._12_4_ * auVar89._12_4_;
          auVar39._16_4_ = auVar88._16_4_ * auVar89._16_4_;
          auVar39._20_4_ = auVar88._20_4_ * auVar89._20_4_;
          auVar39._24_4_ = auVar88._24_4_ * auVar89._24_4_;
          auVar39._28_4_ = auVar88._28_4_;
          auVar73 = vfmsub231ps_fma(auVar39,auVar85,auVar83);
          auVar75 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar77),ZEXT1632(auVar73));
          auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar74),auVar92);
          auVar83 = vrcp14ps_avx512vl(auVar86);
          auVar84 = vfnmadd213ps_avx512vl(auVar83,auVar86,auVar91);
          auVar75 = vfmadd132ps_fma(auVar84,auVar83,auVar83);
          auVar40._4_4_ = auVar73._4_4_ * auVar101._4_4_;
          auVar40._0_4_ = auVar73._0_4_ * auVar101._0_4_;
          auVar40._8_4_ = auVar73._8_4_ * auVar101._8_4_;
          auVar40._12_4_ = auVar73._12_4_ * auVar101._12_4_;
          auVar40._16_4_ = fVar132 * 0.0;
          auVar40._20_4_ = fVar154 * 0.0;
          auVar40._24_4_ = fVar141 * 0.0;
          auVar40._28_4_ = iVar1;
          auVar77 = vfmadd231ps_fma(auVar40,auVar95,ZEXT1632(auVar77));
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar96,ZEXT1632(auVar74));
          fVar141 = auVar75._0_4_;
          fVar132 = auVar75._4_4_;
          fVar154 = auVar75._8_4_;
          fVar157 = auVar75._12_4_;
          local_260 = ZEXT1632(CONCAT412(auVar77._12_4_ * fVar157,
                                         CONCAT48(auVar77._8_4_ * fVar154,
                                                  CONCAT44(auVar77._4_4_ * fVar132,
                                                           auVar77._0_4_ * fVar141))));
          auVar159._4_4_ = fVar133;
          auVar159._0_4_ = fVar133;
          auVar159._8_4_ = fVar133;
          auVar159._12_4_ = fVar133;
          auVar159._16_4_ = fVar133;
          auVar159._20_4_ = fVar133;
          auVar159._24_4_ = fVar133;
          auVar159._28_4_ = fVar133;
          uVar134 = vcmpps_avx512vl(local_260,auVar169,2);
          uVar18 = vcmpps_avx512vl(auVar159,local_260,2);
          bVar70 = (byte)uVar134 & (byte)uVar18 & bVar70;
          auVar181 = ZEXT3264(local_4c0);
          auVar184 = ZEXT3264(local_4e0);
          auVar182 = ZEXT3264(local_500);
          if (bVar70 == 0) {
            uVar64 = 0;
          }
          else {
            uVar134 = vcmpps_avx512vl(auVar86,auVar92,4);
            bVar70 = bVar70 & (byte)uVar134;
            auVar160 = ZEXT1664(local_5d0);
            if (bVar70 != 0) {
              fVar153 = auVar90._0_4_ * fVar141;
              fVar156 = auVar90._4_4_ * fVar132;
              auVar41._4_4_ = fVar156;
              auVar41._0_4_ = fVar153;
              fVar140 = auVar90._8_4_ * fVar154;
              auVar41._8_4_ = fVar140;
              fVar72 = auVar90._12_4_ * fVar157;
              auVar41._12_4_ = fVar72;
              fVar118 = auVar90._16_4_ * 0.0;
              auVar41._16_4_ = fVar118;
              fVar119 = auVar90._20_4_ * 0.0;
              auVar41._20_4_ = fVar119;
              fVar120 = auVar90._24_4_ * 0.0;
              auVar41._24_4_ = fVar120;
              auVar41._28_4_ = auVar86._28_4_;
              auVar83 = vsubps_avx512vl(auVar91,auVar41);
              local_2a0._0_4_ =
                   (float)((uint)(bVar63 & 1) * (int)fVar153 |
                          (uint)!(bool)(bVar63 & 1) * auVar83._0_4_);
              bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
              local_2a0._4_4_ = (float)((uint)bVar12 * (int)fVar156 | (uint)!bVar12 * auVar83._4_4_)
              ;
              bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
              local_2a0._8_4_ = (float)((uint)bVar12 * (int)fVar140 | (uint)!bVar12 * auVar83._8_4_)
              ;
              bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
              local_2a0._12_4_ =
                   (float)((uint)bVar12 * (int)fVar72 | (uint)!bVar12 * auVar83._12_4_);
              bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
              local_2a0._16_4_ =
                   (float)((uint)bVar12 * (int)fVar118 | (uint)!bVar12 * auVar83._16_4_);
              bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
              local_2a0._20_4_ =
                   (float)((uint)bVar12 * (int)fVar119 | (uint)!bVar12 * auVar83._20_4_);
              bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
              local_2a0._24_4_ =
                   (float)((uint)bVar12 * (int)fVar120 | (uint)!bVar12 * auVar83._24_4_);
              bVar12 = SUB81(uVar64 >> 7,0);
              local_2a0._28_4_ =
                   (float)((uint)bVar12 * auVar86._28_4_ | (uint)!bVar12 * auVar83._28_4_);
              auVar86 = vsubps_avx(ZEXT1632(auVar8),auVar81);
              auVar75 = vfmadd213ps_fma(auVar86,local_2a0,auVar81);
              uVar126 = *(undefined4 *)((long)local_5e0->ray_space + k * 4 + -0x10);
              auVar21._4_4_ = uVar126;
              auVar21._0_4_ = uVar126;
              auVar21._8_4_ = uVar126;
              auVar21._12_4_ = uVar126;
              auVar21._16_4_ = uVar126;
              auVar21._20_4_ = uVar126;
              auVar21._24_4_ = uVar126;
              auVar21._28_4_ = uVar126;
              auVar86 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar75._12_4_ + auVar75._12_4_,
                                                           CONCAT48(auVar75._8_4_ + auVar75._8_4_,
                                                                    CONCAT44(auVar75._4_4_ +
                                                                             auVar75._4_4_,
                                                                             auVar75._0_4_ +
                                                                             auVar75._0_4_)))),
                                        auVar21);
              uVar134 = vcmpps_avx512vl(local_260,auVar86,6);
              if (((byte)uVar134 & bVar70) != 0) {
                auVar145._0_4_ = auVar82._0_4_ * fVar141;
                auVar145._4_4_ = auVar82._4_4_ * fVar132;
                auVar145._8_4_ = auVar82._8_4_ * fVar154;
                auVar145._12_4_ = auVar82._12_4_ * fVar157;
                auVar145._16_4_ = auVar82._16_4_ * 0.0;
                auVar145._20_4_ = auVar82._20_4_ * 0.0;
                auVar145._24_4_ = auVar82._24_4_ * 0.0;
                auVar145._28_4_ = 0;
                auVar86 = vsubps_avx512vl(auVar91,auVar145);
                auVar107._0_4_ =
                     (uint)(bVar63 & 1) * (int)auVar145._0_4_ |
                     (uint)!(bool)(bVar63 & 1) * auVar86._0_4_;
                bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
                auVar107._4_4_ = (uint)bVar12 * (int)auVar145._4_4_ | (uint)!bVar12 * auVar86._4_4_;
                bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
                auVar107._8_4_ = (uint)bVar12 * (int)auVar145._8_4_ | (uint)!bVar12 * auVar86._8_4_;
                bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
                auVar107._12_4_ =
                     (uint)bVar12 * (int)auVar145._12_4_ | (uint)!bVar12 * auVar86._12_4_;
                bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
                auVar107._16_4_ =
                     (uint)bVar12 * (int)auVar145._16_4_ | (uint)!bVar12 * auVar86._16_4_;
                bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
                auVar107._20_4_ =
                     (uint)bVar12 * (int)auVar145._20_4_ | (uint)!bVar12 * auVar86._20_4_;
                bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
                auVar107._24_4_ =
                     (uint)bVar12 * (int)auVar145._24_4_ | (uint)!bVar12 * auVar86._24_4_;
                auVar107._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar86._28_4_;
                auVar22._8_4_ = 0x40000000;
                auVar22._0_8_ = 0x4000000040000000;
                auVar22._12_4_ = 0x40000000;
                auVar22._16_4_ = 0x40000000;
                auVar22._20_4_ = 0x40000000;
                auVar22._24_4_ = 0x40000000;
                auVar22._28_4_ = 0x40000000;
                local_280 = vfmsub132ps_avx512vl(auVar107,auVar91,auVar22);
                local_240 = 0;
                local_220 = local_510._0_8_;
                uStack_218 = local_510._8_8_;
                local_210 = local_520._0_8_;
                uStack_208 = local_520._8_8_;
                if ((pGVar69->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar64 = CONCAT71((int7)((ulong)pGVar69 >> 8),1),
                     pGVar69->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar141 = 1.0 / auVar166._0_4_;
                    local_1e0[0] = fVar141 * (local_2a0._0_4_ + 0.0);
                    local_1e0[1] = fVar141 * (local_2a0._4_4_ + 1.0);
                    local_1e0[2] = fVar141 * (local_2a0._8_4_ + 2.0);
                    local_1e0[3] = fVar141 * (local_2a0._12_4_ + 3.0);
                    fStack_1d0 = fVar141 * (local_2a0._16_4_ + 4.0);
                    fStack_1cc = fVar141 * (local_2a0._20_4_ + 5.0);
                    fStack_1c8 = fVar141 * (local_2a0._24_4_ + 6.0);
                    fStack_1c4 = local_2a0._28_4_ + 7.0;
                    local_1c0 = local_280;
                    local_1a0 = local_260;
                    uVar71 = 0;
                    local_380 = (ulong)((byte)uVar134 & bVar70);
                    for (uVar64 = local_380; (uVar64 & 1) == 0;
                        uVar64 = uVar64 >> 1 | 0x8000000000000000) {
                      uVar71 = uVar71 + 1;
                    }
                    local_5b0 = vpbroadcastd_avx512vl();
                    local_5c0 = vpbroadcastd_avx512vl();
                    uVar64 = uVar71;
                    local_480 = fVar133;
                    local_3e0 = auVar169;
                    local_23c = iVar10;
                    local_230 = local_5d0;
                    do {
                      auVar74 = auVar180._0_16_;
                      local_320 = local_1e0[uVar71];
                      local_2c0 = (uint)uVar71;
                      uStack_2bc = (undefined4)(uVar71 >> 0x20);
                      local_310 = *(undefined4 *)(local_1c0 + uVar71 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar71 * 4);
                      local_590.context = context->user;
                      fVar132 = 1.0 - local_320;
                      fVar141 = fVar132 * fVar132 * -3.0;
                      auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * fVar132)),
                                                ZEXT416((uint)(local_320 * fVar132)),
                                                ZEXT416(0xc0000000));
                      auVar77 = vfmsub132ss_fma(ZEXT416((uint)(local_320 * fVar132)),
                                                ZEXT416((uint)(local_320 * local_320)),
                                                ZEXT416(0x40000000));
                      fVar132 = auVar75._0_4_ * 3.0;
                      fVar154 = auVar77._0_4_ * 3.0;
                      fVar157 = local_320 * local_320 * 3.0;
                      auVar151._0_4_ = fVar157 * (float)local_390._0_4_;
                      auVar151._4_4_ = fVar157 * (float)local_390._4_4_;
                      auVar151._8_4_ = fVar157 * fStack_388;
                      auVar151._12_4_ = fVar157 * fStack_384;
                      auVar127._4_4_ = fVar154;
                      auVar127._0_4_ = fVar154;
                      auVar127._8_4_ = fVar154;
                      auVar127._12_4_ = fVar154;
                      auVar75 = vfmadd132ps_fma(auVar127,auVar151,local_520);
                      auVar143._4_4_ = fVar132;
                      auVar143._0_4_ = fVar132;
                      auVar143._8_4_ = fVar132;
                      auVar143._12_4_ = fVar132;
                      auVar75 = vfmadd132ps_fma(auVar143,auVar75,local_510);
                      auVar128._4_4_ = fVar141;
                      auVar128._0_4_ = fVar141;
                      auVar128._8_4_ = fVar141;
                      auVar128._12_4_ = fVar141;
                      auVar75 = vfmadd213ps_fma(auVar128,auVar160._0_16_,auVar75);
                      local_350 = auVar75._0_4_;
                      local_340 = vshufps_avx(auVar75,auVar75,0x55);
                      local_330 = vshufps_avx(auVar75,auVar75,0xaa);
                      local_300 = local_5c0._0_8_;
                      uStack_2f8 = local_5c0._8_8_;
                      local_2f0 = local_5b0;
                      vpcmpeqd_avx2(ZEXT1632(local_5b0),ZEXT1632(local_5b0));
                      uStack_2dc = (local_590.context)->instID[0];
                      local_2e0 = uStack_2dc;
                      uStack_2d8 = uStack_2dc;
                      uStack_2d4 = uStack_2dc;
                      uStack_2d0 = (local_590.context)->instPrimID[0];
                      uStack_2cc = uStack_2d0;
                      uStack_2c8 = uStack_2d0;
                      uStack_2c4 = uStack_2d0;
                      local_5f0 = local_3a0;
                      local_590.valid = (int *)local_5f0;
                      local_590.geometryUserPtr = *(void **)(local_460._0_8_ + 0x18);
                      local_590.hit = (RTCHitN *)&local_350;
                      local_590.N = 4;
                      local_590.ray = (RTCRayN *)ray;
                      uStack_34c = local_350;
                      uStack_348 = local_350;
                      uStack_344 = local_350;
                      fStack_31c = local_320;
                      fStack_318 = local_320;
                      fStack_314 = local_320;
                      uStack_30c = local_310;
                      uStack_308 = local_310;
                      uStack_304 = local_310;
                      if (*(code **)(local_460._0_8_ + 0x48) != (code *)0x0) {
                        (**(code **)(local_460._0_8_ + 0x48))(&local_590);
                        auVar171 = ZEXT3264(local_3e0);
                        auVar182 = ZEXT3264(local_500);
                        auVar184 = ZEXT3264(local_4e0);
                        auVar181 = ZEXT3264(local_4c0);
                        auVar176 = ZEXT3264(local_560);
                        auVar175 = ZEXT3264(local_440);
                        auVar179 = ZEXT3264(local_420);
                        auVar178 = ZEXT3264(local_400);
                        auVar177 = ZEXT3264(local_3c0);
                        auVar160 = ZEXT1664(local_5d0);
                        auVar75 = vxorps_avx512vl(auVar74,auVar74);
                        auVar180 = ZEXT1664(auVar75);
                        fVar133 = local_480;
                      }
                      auVar75 = auVar180._0_16_;
                      uVar71 = vptestmd_avx512vl(local_5f0,local_5f0);
                      if ((uVar71 & 0xf) == 0) {
                        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar183 = ZEXT3264(auVar86);
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if (p_Var11 == (RTCFilterFunctionN)0x0) {
                          auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar183 = ZEXT3264(auVar86);
                        }
                        else {
                          auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar183 = ZEXT3264(auVar86);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             ((*(byte *)(local_460._0_8_ + 0x3e) & 0x40) != 0)) {
                            (*p_Var11)(&local_590);
                            auVar171 = ZEXT3264(local_3e0);
                            auVar182 = ZEXT3264(local_500);
                            auVar184 = ZEXT3264(local_4e0);
                            auVar181 = ZEXT3264(local_4c0);
                            auVar176 = ZEXT3264(local_560);
                            auVar175 = ZEXT3264(local_440);
                            auVar179 = ZEXT3264(local_420);
                            auVar178 = ZEXT3264(local_400);
                            auVar177 = ZEXT3264(local_3c0);
                            auVar160 = ZEXT1664(local_5d0);
                            auVar75 = vxorps_avx512vl(auVar75,auVar75);
                            auVar180 = ZEXT1664(auVar75);
                            auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar183 = ZEXT3264(auVar86);
                            fVar133 = local_480;
                          }
                        }
                        uVar71 = vptestmd_avx512vl(local_5f0,local_5f0);
                        uVar71 = uVar71 & 0xf;
                        auVar75 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar12 = (bool)((byte)uVar71 & 1);
                        bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
                        bVar15 = SUB81(uVar71 >> 3,0);
                        *(uint *)(local_590.ray + 0x80) =
                             (uint)bVar12 * auVar75._0_4_ |
                             (uint)!bVar12 * *(int *)(local_590.ray + 0x80);
                        *(uint *)(local_590.ray + 0x84) =
                             (uint)bVar13 * auVar75._4_4_ |
                             (uint)!bVar13 * *(int *)(local_590.ray + 0x84);
                        *(uint *)(local_590.ray + 0x88) =
                             (uint)bVar14 * auVar75._8_4_ |
                             (uint)!bVar14 * *(int *)(local_590.ray + 0x88);
                        *(uint *)(local_590.ray + 0x8c) =
                             (uint)bVar15 * auVar75._12_4_ |
                             (uint)!bVar15 * *(int *)(local_590.ray + 0x8c);
                        if ((byte)uVar71 != 0) {
                          uVar64 = CONCAT71((int7)(uVar64 >> 8),1);
                          break;
                        }
                      }
                      *(int *)(ray + k * 4 + 0x80) = auVar171._0_4_;
                      uVar64 = 0;
                      uVar71 = 0;
                      local_380 = local_380 ^ 1L << ((ulong)local_2c0 & 0x3f);
                      for (uVar67 = local_380; (uVar67 & 1) == 0;
                          uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                        uVar71 = uVar71 + 1;
                      }
                    } while (local_380 != 0);
                  }
                  goto LAB_01c85d12;
                }
              }
            }
            uVar64 = 0;
          }
        }
      }
LAB_01c85d12:
      if (8 < iVar10) {
        local_460 = vpbroadcastd_avx512vl();
        fStack_378 = 1.0 / (float)local_540._0_4_;
        local_540 = vpbroadcastd_avx512vl();
        local_530 = vpbroadcastd_avx512vl();
        lVar68 = 8;
        local_480 = fVar125;
        fStack_47c = fVar125;
        fStack_478 = fVar125;
        fStack_474 = fVar125;
        fStack_470 = fVar125;
        fStack_46c = fVar125;
        fStack_468 = fVar125;
        fStack_464 = fVar125;
        fStack_374 = fStack_378;
        fStack_370 = fStack_378;
        fStack_36c = fStack_378;
        fStack_368 = fStack_378;
        fStack_364 = fStack_378;
        local_2c0 = (uint)fVar133;
        uStack_2bc = fVar133;
        uStack_2b8 = fVar133;
        uStack_2b4 = fVar133;
        uStack_2b0 = fVar133;
        uStack_2ac = fVar133;
        uStack_2a8 = fVar133;
        uStack_2a4 = fVar133;
        local_380._0_4_ = fStack_378;
        local_380._4_4_ = fStack_378;
        do {
          auVar86 = vpbroadcastd_avx512vl();
          auVar88 = vpor_avx2(auVar86,_DAT_01fe9900);
          uVar18 = vpcmpd_avx512vl(auVar88,local_460,1);
          auVar86 = *(undefined1 (*) [32])(bezier_basis0 + lVar68 * 4 + lVar19);
          auVar83 = *(undefined1 (*) [32])(lVar19 + 0x21aa768 + lVar68 * 4);
          auVar84 = *(undefined1 (*) [32])(lVar19 + 0x21aabec + lVar68 * 4);
          auVar85 = *(undefined1 (*) [32])(lVar19 + 0x21ab070 + lVar68 * 4);
          local_4e0 = auVar184._0_32_;
          auVar87 = vmulps_avx512vl(local_4e0,auVar85);
          local_500 = auVar182._0_32_;
          auVar96 = vmulps_avx512vl(local_500,auVar85);
          auVar42._4_4_ = auVar85._4_4_ * (float)local_100._4_4_;
          auVar42._0_4_ = auVar85._0_4_ * (float)local_100._0_4_;
          auVar42._8_4_ = auVar85._8_4_ * fStack_f8;
          auVar42._12_4_ = auVar85._12_4_ * fStack_f4;
          auVar42._16_4_ = auVar85._16_4_ * fStack_f0;
          auVar42._20_4_ = auVar85._20_4_ * fStack_ec;
          auVar42._24_4_ = auVar85._24_4_ * fStack_e8;
          auVar42._28_4_ = auVar88._28_4_;
          auVar138 = auVar176._0_32_;
          auVar88 = vfmadd231ps_avx512vl(auVar87,auVar84,auVar138);
          local_4c0 = auVar181._0_32_;
          auVar87 = vfmadd231ps_avx512vl(auVar96,auVar84,local_4c0);
          auVar96 = vfmadd231ps_avx512vl(auVar42,auVar84,local_e0);
          auVar158 = auVar179._0_32_;
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar83,auVar158);
          auVar135 = auVar175._0_32_;
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar83,auVar135);
          auVar75 = vfmadd231ps_fma(auVar96,auVar83,local_c0);
          local_3c0 = auVar177._0_32_;
          auVar82 = vfmadd231ps_avx512vl(auVar88,auVar86,local_3c0);
          auVar155 = auVar178._0_32_;
          auVar91 = vfmadd231ps_avx512vl(auVar87,auVar86,auVar155);
          auVar88 = *(undefined1 (*) [32])(bezier_basis1 + lVar68 * 4 + lVar19);
          auVar87 = *(undefined1 (*) [32])(lVar19 + 0x21acb88 + lVar68 * 4);
          auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar86,local_a0);
          auVar96 = *(undefined1 (*) [32])(lVar19 + 0x21ad00c + lVar68 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar19 + 0x21ad490 + lVar68 * 4);
          auVar89 = vmulps_avx512vl(local_4e0,auVar95);
          auVar90 = vmulps_avx512vl(local_500,auVar95);
          auVar43._4_4_ = auVar95._4_4_ * (float)local_100._4_4_;
          auVar43._0_4_ = auVar95._0_4_ * (float)local_100._0_4_;
          auVar43._8_4_ = auVar95._8_4_ * fStack_f8;
          auVar43._12_4_ = auVar95._12_4_ * fStack_f4;
          auVar43._16_4_ = auVar95._16_4_ * fStack_f0;
          auVar43._20_4_ = auVar95._20_4_ * fStack_ec;
          auVar43._24_4_ = auVar95._24_4_ * fStack_e8;
          auVar43._28_4_ = uStack_e4;
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar96,auVar138);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar96,local_4c0);
          auVar92 = vfmadd231ps_avx512vl(auVar43,auVar96,local_e0);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar158);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar87,auVar135);
          auVar77 = vfmadd231ps_fma(auVar92,auVar87,local_c0);
          auVar92 = vfmadd231ps_avx512vl(auVar89,auVar88,local_3c0);
          auVar80 = vfmadd231ps_avx512vl(auVar90,auVar88,auVar155);
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar88,local_a0);
          auVar81 = vmaxps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar77));
          auVar89 = vsubps_avx(auVar92,auVar82);
          auVar90 = vsubps_avx(auVar80,auVar91);
          auVar93 = vmulps_avx512vl(auVar91,auVar89);
          auVar94 = vmulps_avx512vl(auVar82,auVar90);
          auVar93 = vsubps_avx512vl(auVar93,auVar94);
          auVar94 = vmulps_avx512vl(auVar90,auVar90);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,auVar89);
          auVar81 = vmulps_avx512vl(auVar81,auVar81);
          auVar81 = vmulps_avx512vl(auVar81,auVar94);
          auVar93 = vmulps_avx512vl(auVar93,auVar93);
          uVar134 = vcmpps_avx512vl(auVar93,auVar81,2);
          bVar70 = (byte)uVar18 & (byte)uVar134;
          if (bVar70 == 0) {
            auVar175 = ZEXT3264(auVar135);
            auVar176 = ZEXT3264(auVar138);
          }
          else {
            auVar95 = vmulps_avx512vl(local_4a0,auVar95);
            auVar96 = vfmadd213ps_avx512vl(auVar96,local_160,auVar95);
            auVar87 = vfmadd213ps_avx512vl(auVar87,local_140,auVar96);
            auVar88 = vfmadd213ps_avx512vl(auVar88,local_120,auVar87);
            auVar85 = vmulps_avx512vl(local_4a0,auVar85);
            auVar84 = vfmadd213ps_avx512vl(auVar84,local_160,auVar85);
            auVar83 = vfmadd213ps_avx512vl(auVar83,local_140,auVar84);
            auVar87 = vfmadd213ps_avx512vl(auVar86,local_120,auVar83);
            auVar86 = *(undefined1 (*) [32])(lVar19 + 0x21ab4f4 + lVar68 * 4);
            auVar83 = *(undefined1 (*) [32])(lVar19 + 0x21ab978 + lVar68 * 4);
            auVar84 = *(undefined1 (*) [32])(lVar19 + 0x21abdfc + lVar68 * 4);
            auVar85 = *(undefined1 (*) [32])(lVar19 + 0x21ac280 + lVar68 * 4);
            auVar96 = vmulps_avx512vl(local_4e0,auVar85);
            auVar95 = vmulps_avx512vl(local_500,auVar85);
            auVar85 = vmulps_avx512vl(local_4a0,auVar85);
            auVar96 = vfmadd231ps_avx512vl(auVar96,auVar84,auVar138);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar84,local_4c0);
            auVar84 = vfmadd231ps_avx512vl(auVar85,local_160,auVar84);
            auVar85 = vfmadd231ps_avx512vl(auVar96,auVar83,auVar158);
            auVar96 = vfmadd231ps_avx512vl(auVar95,auVar83,auVar135);
            auVar83 = vfmadd231ps_avx512vl(auVar84,local_140,auVar83);
            auVar85 = vfmadd231ps_avx512vl(auVar85,auVar86,local_3c0);
            auVar96 = vfmadd231ps_avx512vl(auVar96,auVar86,auVar155);
            auVar95 = vfmadd231ps_avx512vl(auVar83,local_120,auVar86);
            auVar86 = *(undefined1 (*) [32])(lVar19 + 0x21ad914 + lVar68 * 4);
            auVar83 = *(undefined1 (*) [32])(lVar19 + 0x21ae21c + lVar68 * 4);
            auVar84 = *(undefined1 (*) [32])(lVar19 + 0x21ae6a0 + lVar68 * 4);
            auVar81 = vmulps_avx512vl(local_4e0,auVar84);
            auVar93 = vmulps_avx512vl(local_500,auVar84);
            auVar84 = vmulps_avx512vl(local_4a0,auVar84);
            auVar81 = vfmadd231ps_avx512vl(auVar81,auVar83,auVar138);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar83,local_4c0);
            auVar84 = vfmadd231ps_avx512vl(auVar84,local_160,auVar83);
            auVar83 = *(undefined1 (*) [32])(lVar19 + 0x21add98 + lVar68 * 4);
            auVar81 = vfmadd231ps_avx512vl(auVar81,auVar83,auVar158);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar83,auVar135);
            auVar83 = vfmadd231ps_avx512vl(auVar84,local_140,auVar83);
            auVar84 = vfmadd231ps_avx512vl(auVar81,auVar86,local_3c0);
            auVar81 = vfmadd231ps_avx512vl(auVar93,auVar86,auVar155);
            auVar83 = vfmadd231ps_avx512vl(auVar83,local_120,auVar86);
            auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar85,auVar93);
            vandps_avx512vl(auVar96,auVar93);
            auVar86 = vmaxps_avx(auVar93,auVar93);
            vandps_avx512vl(auVar95,auVar93);
            auVar86 = vmaxps_avx(auVar86,auVar93);
            auVar61._4_4_ = fStack_47c;
            auVar61._0_4_ = local_480;
            auVar61._8_4_ = fStack_478;
            auVar61._12_4_ = fStack_474;
            auVar61._16_4_ = fStack_470;
            auVar61._20_4_ = fStack_46c;
            auVar61._24_4_ = fStack_468;
            auVar61._28_4_ = fStack_464;
            uVar71 = vcmpps_avx512vl(auVar86,auVar61,1);
            bVar12 = (bool)((byte)uVar71 & 1);
            auVar108._0_4_ = (float)((uint)bVar12 * auVar89._0_4_ | (uint)!bVar12 * auVar85._0_4_);
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar108._4_4_ = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar85._4_4_);
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar108._8_4_ = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar85._8_4_);
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar108._12_4_ =
                 (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar85._12_4_);
            bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar108._16_4_ =
                 (float)((uint)bVar12 * auVar89._16_4_ | (uint)!bVar12 * auVar85._16_4_);
            bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar108._20_4_ =
                 (float)((uint)bVar12 * auVar89._20_4_ | (uint)!bVar12 * auVar85._20_4_);
            bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar108._24_4_ =
                 (float)((uint)bVar12 * auVar89._24_4_ | (uint)!bVar12 * auVar85._24_4_);
            bVar12 = SUB81(uVar71 >> 7,0);
            auVar108._28_4_ = (uint)bVar12 * auVar89._28_4_ | (uint)!bVar12 * auVar85._28_4_;
            bVar12 = (bool)((byte)uVar71 & 1);
            auVar109._0_4_ = (float)((uint)bVar12 * auVar90._0_4_ | (uint)!bVar12 * auVar96._0_4_);
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar109._4_4_ = (float)((uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar96._4_4_);
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar109._8_4_ = (float)((uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar96._8_4_);
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar109._12_4_ =
                 (float)((uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar96._12_4_);
            bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar109._16_4_ =
                 (float)((uint)bVar12 * auVar90._16_4_ | (uint)!bVar12 * auVar96._16_4_);
            bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar109._20_4_ =
                 (float)((uint)bVar12 * auVar90._20_4_ | (uint)!bVar12 * auVar96._20_4_);
            bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar109._24_4_ =
                 (float)((uint)bVar12 * auVar90._24_4_ | (uint)!bVar12 * auVar96._24_4_);
            bVar12 = SUB81(uVar71 >> 7,0);
            auVar109._28_4_ = (uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar96._28_4_;
            vandps_avx512vl(auVar84,auVar93);
            vandps_avx512vl(auVar81,auVar93);
            auVar86 = vmaxps_avx(auVar109,auVar109);
            vandps_avx512vl(auVar83,auVar93);
            auVar86 = vmaxps_avx(auVar86,auVar109);
            uVar71 = vcmpps_avx512vl(auVar86,auVar61,1);
            bVar12 = (bool)((byte)uVar71 & 1);
            auVar110._0_4_ = (uint)bVar12 * auVar89._0_4_ | (uint)!bVar12 * auVar84._0_4_;
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar110._4_4_ = (uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar84._4_4_;
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar110._8_4_ = (uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar84._8_4_;
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar110._12_4_ = (uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar84._12_4_;
            bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar110._16_4_ = (uint)bVar12 * auVar89._16_4_ | (uint)!bVar12 * auVar84._16_4_;
            bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar110._20_4_ = (uint)bVar12 * auVar89._20_4_ | (uint)!bVar12 * auVar84._20_4_;
            bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar110._24_4_ = (uint)bVar12 * auVar89._24_4_ | (uint)!bVar12 * auVar84._24_4_;
            bVar12 = SUB81(uVar71 >> 7,0);
            auVar110._28_4_ = (uint)bVar12 * auVar89._28_4_ | (uint)!bVar12 * auVar84._28_4_;
            bVar12 = (bool)((byte)uVar71 & 1);
            auVar111._0_4_ = (float)((uint)bVar12 * auVar90._0_4_ | (uint)!bVar12 * auVar81._0_4_);
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar111._4_4_ = (float)((uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar81._4_4_);
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar111._8_4_ = (float)((uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar81._8_4_);
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar111._12_4_ =
                 (float)((uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar81._12_4_);
            bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar111._16_4_ =
                 (float)((uint)bVar12 * auVar90._16_4_ | (uint)!bVar12 * auVar81._16_4_);
            bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar111._20_4_ =
                 (float)((uint)bVar12 * auVar90._20_4_ | (uint)!bVar12 * auVar81._20_4_);
            bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar111._24_4_ =
                 (float)((uint)bVar12 * auVar90._24_4_ | (uint)!bVar12 * auVar81._24_4_);
            bVar12 = SUB81(uVar71 >> 7,0);
            auVar111._28_4_ = (uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar81._28_4_;
            auVar163._8_4_ = 0x80000000;
            auVar163._0_8_ = 0x8000000080000000;
            auVar163._12_4_ = 0x80000000;
            auVar163._16_4_ = 0x80000000;
            auVar163._20_4_ = 0x80000000;
            auVar163._24_4_ = 0x80000000;
            auVar163._28_4_ = 0x80000000;
            auVar86 = vxorps_avx512vl(auVar110,auVar163);
            auVar81 = auVar180._0_32_;
            auVar83 = vfmadd213ps_avx512vl(auVar108,auVar108,auVar81);
            auVar74 = vfmadd231ps_fma(auVar83,auVar109,auVar109);
            auVar83 = vrsqrt14ps_avx512vl(ZEXT1632(auVar74));
            auVar174._8_4_ = 0xbf000000;
            auVar174._0_8_ = 0xbf000000bf000000;
            auVar174._12_4_ = 0xbf000000;
            auVar174._16_4_ = 0xbf000000;
            auVar174._20_4_ = 0xbf000000;
            auVar174._24_4_ = 0xbf000000;
            auVar174._28_4_ = 0xbf000000;
            fVar133 = auVar83._0_4_;
            fVar125 = auVar83._4_4_;
            fVar141 = auVar83._8_4_;
            fVar132 = auVar83._12_4_;
            fVar154 = auVar83._16_4_;
            fVar157 = auVar83._20_4_;
            fVar153 = auVar83._24_4_;
            auVar44._4_4_ = fVar125 * fVar125 * fVar125 * auVar74._4_4_ * -0.5;
            auVar44._0_4_ = fVar133 * fVar133 * fVar133 * auVar74._0_4_ * -0.5;
            auVar44._8_4_ = fVar141 * fVar141 * fVar141 * auVar74._8_4_ * -0.5;
            auVar44._12_4_ = fVar132 * fVar132 * fVar132 * auVar74._12_4_ * -0.5;
            auVar44._16_4_ = fVar154 * fVar154 * fVar154 * -0.0;
            auVar44._20_4_ = fVar157 * fVar157 * fVar157 * -0.0;
            auVar44._24_4_ = fVar153 * fVar153 * fVar153 * -0.0;
            auVar44._28_4_ = auVar109._28_4_;
            auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar83 = vfmadd231ps_avx512vl(auVar44,auVar84,auVar83);
            auVar45._4_4_ = auVar109._4_4_ * auVar83._4_4_;
            auVar45._0_4_ = auVar109._0_4_ * auVar83._0_4_;
            auVar45._8_4_ = auVar109._8_4_ * auVar83._8_4_;
            auVar45._12_4_ = auVar109._12_4_ * auVar83._12_4_;
            auVar45._16_4_ = auVar109._16_4_ * auVar83._16_4_;
            auVar45._20_4_ = auVar109._20_4_ * auVar83._20_4_;
            auVar45._24_4_ = auVar109._24_4_ * auVar83._24_4_;
            auVar45._28_4_ = 0;
            auVar46._4_4_ = auVar83._4_4_ * -auVar108._4_4_;
            auVar46._0_4_ = auVar83._0_4_ * -auVar108._0_4_;
            auVar46._8_4_ = auVar83._8_4_ * -auVar108._8_4_;
            auVar46._12_4_ = auVar83._12_4_ * -auVar108._12_4_;
            auVar46._16_4_ = auVar83._16_4_ * -auVar108._16_4_;
            auVar46._20_4_ = auVar83._20_4_ * -auVar108._20_4_;
            auVar46._24_4_ = auVar83._24_4_ * -auVar108._24_4_;
            auVar46._28_4_ = auVar109._28_4_;
            auVar85 = vmulps_avx512vl(auVar83,auVar81);
            auVar83 = vfmadd213ps_avx512vl(auVar110,auVar110,auVar81);
            auVar83 = vfmadd231ps_avx512vl(auVar83,auVar111,auVar111);
            auVar96 = vrsqrt14ps_avx512vl(auVar83);
            auVar83 = vmulps_avx512vl(auVar83,auVar174);
            fVar133 = auVar96._0_4_;
            fVar125 = auVar96._4_4_;
            fVar141 = auVar96._8_4_;
            fVar132 = auVar96._12_4_;
            fVar154 = auVar96._16_4_;
            fVar157 = auVar96._20_4_;
            fVar153 = auVar96._24_4_;
            auVar47._4_4_ = fVar125 * fVar125 * fVar125 * auVar83._4_4_;
            auVar47._0_4_ = fVar133 * fVar133 * fVar133 * auVar83._0_4_;
            auVar47._8_4_ = fVar141 * fVar141 * fVar141 * auVar83._8_4_;
            auVar47._12_4_ = fVar132 * fVar132 * fVar132 * auVar83._12_4_;
            auVar47._16_4_ = fVar154 * fVar154 * fVar154 * auVar83._16_4_;
            auVar47._20_4_ = fVar157 * fVar157 * fVar157 * auVar83._20_4_;
            auVar47._24_4_ = fVar153 * fVar153 * fVar153 * auVar83._24_4_;
            auVar47._28_4_ = auVar83._28_4_;
            auVar83 = vfmadd231ps_avx512vl(auVar47,auVar84,auVar96);
            auVar48._4_4_ = auVar111._4_4_ * auVar83._4_4_;
            auVar48._0_4_ = auVar111._0_4_ * auVar83._0_4_;
            auVar48._8_4_ = auVar111._8_4_ * auVar83._8_4_;
            auVar48._12_4_ = auVar111._12_4_ * auVar83._12_4_;
            auVar48._16_4_ = auVar111._16_4_ * auVar83._16_4_;
            auVar48._20_4_ = auVar111._20_4_ * auVar83._20_4_;
            auVar48._24_4_ = auVar111._24_4_ * auVar83._24_4_;
            auVar48._28_4_ = auVar96._28_4_;
            auVar49._4_4_ = auVar83._4_4_ * auVar86._4_4_;
            auVar49._0_4_ = auVar83._0_4_ * auVar86._0_4_;
            auVar49._8_4_ = auVar83._8_4_ * auVar86._8_4_;
            auVar49._12_4_ = auVar83._12_4_ * auVar86._12_4_;
            auVar49._16_4_ = auVar83._16_4_ * auVar86._16_4_;
            auVar49._20_4_ = auVar83._20_4_ * auVar86._20_4_;
            auVar49._24_4_ = auVar83._24_4_ * auVar86._24_4_;
            auVar49._28_4_ = auVar86._28_4_;
            auVar86 = vmulps_avx512vl(auVar83,auVar81);
            auVar74 = vfmadd213ps_fma(auVar45,ZEXT1632(auVar75),auVar82);
            auVar83 = ZEXT1632(auVar75);
            auVar73 = vfmadd213ps_fma(auVar46,auVar83,auVar91);
            auVar84 = vfmadd213ps_avx512vl(auVar85,auVar83,auVar87);
            auVar96 = vfmadd213ps_avx512vl(auVar48,ZEXT1632(auVar77),auVar92);
            auVar76 = vfnmadd213ps_fma(auVar45,auVar83,auVar82);
            auVar95 = ZEXT1632(auVar77);
            auVar5 = vfmadd213ps_fma(auVar49,auVar95,auVar80);
            auVar78 = vfnmadd213ps_fma(auVar46,auVar83,auVar91);
            auVar6 = vfmadd213ps_fma(auVar86,auVar95,auVar88);
            auVar91 = ZEXT1632(auVar75);
            auVar79 = vfnmadd231ps_fma(auVar87,auVar91,auVar85);
            auVar137 = vfnmadd213ps_fma(auVar48,auVar95,auVar92);
            auVar142 = vfnmadd213ps_fma(auVar49,auVar95,auVar80);
            auVar161 = vfnmadd231ps_fma(auVar88,ZEXT1632(auVar77),auVar86);
            auVar88 = vsubps_avx512vl(auVar96,ZEXT1632(auVar76));
            auVar86 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar78));
            auVar83 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar79));
            auVar50._4_4_ = auVar86._4_4_ * auVar79._4_4_;
            auVar50._0_4_ = auVar86._0_4_ * auVar79._0_4_;
            auVar50._8_4_ = auVar86._8_4_ * auVar79._8_4_;
            auVar50._12_4_ = auVar86._12_4_ * auVar79._12_4_;
            auVar50._16_4_ = auVar86._16_4_ * 0.0;
            auVar50._20_4_ = auVar86._20_4_ * 0.0;
            auVar50._24_4_ = auVar86._24_4_ * 0.0;
            auVar50._28_4_ = auVar85._28_4_;
            auVar75 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar78),auVar83);
            auVar51._4_4_ = auVar83._4_4_ * auVar76._4_4_;
            auVar51._0_4_ = auVar83._0_4_ * auVar76._0_4_;
            auVar51._8_4_ = auVar83._8_4_ * auVar76._8_4_;
            auVar51._12_4_ = auVar83._12_4_ * auVar76._12_4_;
            auVar51._16_4_ = auVar83._16_4_ * 0.0;
            auVar51._20_4_ = auVar83._20_4_ * 0.0;
            auVar51._24_4_ = auVar83._24_4_ * 0.0;
            auVar51._28_4_ = auVar83._28_4_;
            auVar7 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar79),auVar88);
            auVar52._4_4_ = auVar78._4_4_ * auVar88._4_4_;
            auVar52._0_4_ = auVar78._0_4_ * auVar88._0_4_;
            auVar52._8_4_ = auVar78._8_4_ * auVar88._8_4_;
            auVar52._12_4_ = auVar78._12_4_ * auVar88._12_4_;
            auVar52._16_4_ = auVar88._16_4_ * 0.0;
            auVar52._20_4_ = auVar88._20_4_ * 0.0;
            auVar52._24_4_ = auVar88._24_4_ * 0.0;
            auVar52._28_4_ = auVar88._28_4_;
            auVar8 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar76),auVar86);
            auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar81,ZEXT1632(auVar7));
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar81,ZEXT1632(auVar75));
            uVar71 = vcmpps_avx512vl(auVar86,auVar81,2);
            bVar63 = (byte)uVar71;
            fVar72 = (float)((uint)(bVar63 & 1) * auVar74._0_4_ |
                            (uint)!(bool)(bVar63 & 1) * auVar137._0_4_);
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            fVar119 = (float)((uint)bVar12 * auVar74._4_4_ | (uint)!bVar12 * auVar137._4_4_);
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            fVar121 = (float)((uint)bVar12 * auVar74._8_4_ | (uint)!bVar12 * auVar137._8_4_);
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            fVar123 = (float)((uint)bVar12 * auVar74._12_4_ | (uint)!bVar12 * auVar137._12_4_);
            auVar95 = ZEXT1632(CONCAT412(fVar123,CONCAT48(fVar121,CONCAT44(fVar119,fVar72))));
            fVar118 = (float)((uint)(bVar63 & 1) * auVar73._0_4_ |
                             (uint)!(bool)(bVar63 & 1) * auVar142._0_4_);
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            fVar120 = (float)((uint)bVar12 * auVar73._4_4_ | (uint)!bVar12 * auVar142._4_4_);
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            fVar122 = (float)((uint)bVar12 * auVar73._8_4_ | (uint)!bVar12 * auVar142._8_4_);
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            fVar124 = (float)((uint)bVar12 * auVar73._12_4_ | (uint)!bVar12 * auVar142._12_4_);
            auVar89 = ZEXT1632(CONCAT412(fVar124,CONCAT48(fVar122,CONCAT44(fVar120,fVar118))));
            auVar112._0_4_ =
                 (float)((uint)(bVar63 & 1) * auVar84._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar161._0_4_);
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar112._4_4_ = (float)((uint)bVar12 * auVar84._4_4_ | (uint)!bVar12 * auVar161._4_4_);
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar112._8_4_ = (float)((uint)bVar12 * auVar84._8_4_ | (uint)!bVar12 * auVar161._8_4_);
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar112._12_4_ =
                 (float)((uint)bVar12 * auVar84._12_4_ | (uint)!bVar12 * auVar161._12_4_);
            fVar125 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar84._16_4_);
            auVar112._16_4_ = fVar125;
            fVar141 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar84._20_4_);
            auVar112._20_4_ = fVar141;
            fVar133 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar84._24_4_);
            auVar112._24_4_ = fVar133;
            iVar1 = (uint)(byte)(uVar71 >> 7) * auVar84._28_4_;
            auVar112._28_4_ = iVar1;
            auVar86 = vblendmps_avx512vl(ZEXT1632(auVar76),auVar96);
            auVar113._0_4_ =
                 (uint)(bVar63 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar75._0_4_;
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar113._4_4_ = (uint)bVar12 * auVar86._4_4_ | (uint)!bVar12 * auVar75._4_4_;
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar113._8_4_ = (uint)bVar12 * auVar86._8_4_ | (uint)!bVar12 * auVar75._8_4_;
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar113._12_4_ = (uint)bVar12 * auVar86._12_4_ | (uint)!bVar12 * auVar75._12_4_;
            auVar113._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar86._16_4_;
            auVar113._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar86._20_4_;
            auVar113._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar86._24_4_;
            auVar113._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar86._28_4_;
            auVar86 = vblendmps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar5));
            auVar114._0_4_ =
                 (float)((uint)(bVar63 & 1) * auVar86._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar74._0_4_);
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar114._4_4_ = (float)((uint)bVar12 * auVar86._4_4_ | (uint)!bVar12 * auVar74._4_4_);
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar114._8_4_ = (float)((uint)bVar12 * auVar86._8_4_ | (uint)!bVar12 * auVar74._8_4_);
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar114._12_4_ =
                 (float)((uint)bVar12 * auVar86._12_4_ | (uint)!bVar12 * auVar74._12_4_);
            fVar132 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar86._16_4_);
            auVar114._16_4_ = fVar132;
            fVar154 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar86._20_4_);
            auVar114._20_4_ = fVar154;
            fVar157 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar86._24_4_);
            auVar114._24_4_ = fVar157;
            auVar114._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar86._28_4_;
            auVar86 = vblendmps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar6));
            auVar115._0_4_ =
                 (float)((uint)(bVar63 & 1) * auVar86._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar73._0_4_);
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar115._4_4_ = (float)((uint)bVar12 * auVar86._4_4_ | (uint)!bVar12 * auVar73._4_4_);
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar115._8_4_ = (float)((uint)bVar12 * auVar86._8_4_ | (uint)!bVar12 * auVar73._8_4_);
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar115._12_4_ =
                 (float)((uint)bVar12 * auVar86._12_4_ | (uint)!bVar12 * auVar73._12_4_);
            fVar153 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar86._16_4_);
            auVar115._16_4_ = fVar153;
            fVar140 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar86._20_4_);
            auVar115._20_4_ = fVar140;
            fVar156 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar86._24_4_);
            auVar115._24_4_ = fVar156;
            iVar2 = (uint)(byte)(uVar71 >> 7) * auVar86._28_4_;
            auVar115._28_4_ = iVar2;
            auVar116._0_4_ =
                 (uint)(bVar63 & 1) * (int)auVar76._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar96._0_4_
            ;
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar116._4_4_ = (uint)bVar12 * (int)auVar76._4_4_ | (uint)!bVar12 * auVar96._4_4_;
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar116._8_4_ = (uint)bVar12 * (int)auVar76._8_4_ | (uint)!bVar12 * auVar96._8_4_;
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar116._12_4_ = (uint)bVar12 * (int)auVar76._12_4_ | (uint)!bVar12 * auVar96._12_4_;
            auVar116._16_4_ = (uint)!(bool)((byte)(uVar71 >> 4) & 1) * auVar96._16_4_;
            auVar116._20_4_ = (uint)!(bool)((byte)(uVar71 >> 5) & 1) * auVar96._20_4_;
            auVar116._24_4_ = (uint)!(bool)((byte)(uVar71 >> 6) & 1) * auVar96._24_4_;
            auVar116._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar96._28_4_;
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar71 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar96 = vsubps_avx512vl(auVar116,auVar95);
            auVar83 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar78._12_4_ |
                                                    (uint)!bVar16 * auVar5._12_4_,
                                                    CONCAT48((uint)bVar14 * (int)auVar78._8_4_ |
                                                             (uint)!bVar14 * auVar5._8_4_,
                                                             CONCAT44((uint)bVar12 *
                                                                      (int)auVar78._4_4_ |
                                                                      (uint)!bVar12 * auVar5._4_4_,
                                                                      (uint)(bVar63 & 1) *
                                                                      (int)auVar78._0_4_ |
                                                                      (uint)!(bool)(bVar63 & 1) *
                                                                      auVar5._0_4_)))),auVar89);
            auVar84 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar79._12_4_ |
                                                    (uint)!bVar17 * auVar6._12_4_,
                                                    CONCAT48((uint)bVar15 * (int)auVar79._8_4_ |
                                                             (uint)!bVar15 * auVar6._8_4_,
                                                             CONCAT44((uint)bVar13 *
                                                                      (int)auVar79._4_4_ |
                                                                      (uint)!bVar13 * auVar6._4_4_,
                                                                      (uint)(bVar63 & 1) *
                                                                      (int)auVar79._0_4_ |
                                                                      (uint)!(bool)(bVar63 & 1) *
                                                                      auVar6._0_4_)))),auVar112);
            auVar85 = vsubps_avx(auVar95,auVar113);
            auVar88 = vsubps_avx(auVar89,auVar114);
            auVar87 = vsubps_avx(auVar112,auVar115);
            auVar53._4_4_ = auVar84._4_4_ * fVar119;
            auVar53._0_4_ = auVar84._0_4_ * fVar72;
            auVar53._8_4_ = auVar84._8_4_ * fVar121;
            auVar53._12_4_ = auVar84._12_4_ * fVar123;
            auVar53._16_4_ = auVar84._16_4_ * 0.0;
            auVar53._20_4_ = auVar84._20_4_ * 0.0;
            auVar53._24_4_ = auVar84._24_4_ * 0.0;
            auVar53._28_4_ = 0;
            auVar75 = vfmsub231ps_fma(auVar53,auVar112,auVar96);
            auVar146._0_4_ = fVar118 * auVar96._0_4_;
            auVar146._4_4_ = fVar120 * auVar96._4_4_;
            auVar146._8_4_ = fVar122 * auVar96._8_4_;
            auVar146._12_4_ = fVar124 * auVar96._12_4_;
            auVar146._16_4_ = auVar96._16_4_ * 0.0;
            auVar146._20_4_ = auVar96._20_4_ * 0.0;
            auVar146._24_4_ = auVar96._24_4_ * 0.0;
            auVar146._28_4_ = 0;
            auVar74 = vfmsub231ps_fma(auVar146,auVar95,auVar83);
            auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar81,ZEXT1632(auVar75));
            auVar149._0_4_ = auVar83._0_4_ * auVar112._0_4_;
            auVar149._4_4_ = auVar83._4_4_ * auVar112._4_4_;
            auVar149._8_4_ = auVar83._8_4_ * auVar112._8_4_;
            auVar149._12_4_ = auVar83._12_4_ * auVar112._12_4_;
            auVar149._16_4_ = auVar83._16_4_ * fVar125;
            auVar149._20_4_ = auVar83._20_4_ * fVar141;
            auVar149._24_4_ = auVar83._24_4_ * fVar133;
            auVar149._28_4_ = 0;
            auVar75 = vfmsub231ps_fma(auVar149,auVar89,auVar84);
            auVar90 = vfmadd231ps_avx512vl(auVar86,auVar81,ZEXT1632(auVar75));
            auVar86 = vmulps_avx512vl(auVar87,auVar113);
            auVar86 = vfmsub231ps_avx512vl(auVar86,auVar85,auVar115);
            auVar54._4_4_ = auVar88._4_4_ * auVar115._4_4_;
            auVar54._0_4_ = auVar88._0_4_ * auVar115._0_4_;
            auVar54._8_4_ = auVar88._8_4_ * auVar115._8_4_;
            auVar54._12_4_ = auVar88._12_4_ * auVar115._12_4_;
            auVar54._16_4_ = auVar88._16_4_ * fVar153;
            auVar54._20_4_ = auVar88._20_4_ * fVar140;
            auVar54._24_4_ = auVar88._24_4_ * fVar156;
            auVar54._28_4_ = iVar2;
            auVar75 = vfmsub231ps_fma(auVar54,auVar114,auVar87);
            auVar150._0_4_ = auVar114._0_4_ * auVar85._0_4_;
            auVar150._4_4_ = auVar114._4_4_ * auVar85._4_4_;
            auVar150._8_4_ = auVar114._8_4_ * auVar85._8_4_;
            auVar150._12_4_ = auVar114._12_4_ * auVar85._12_4_;
            auVar150._16_4_ = fVar132 * auVar85._16_4_;
            auVar150._20_4_ = fVar154 * auVar85._20_4_;
            auVar150._24_4_ = fVar157 * auVar85._24_4_;
            auVar150._28_4_ = 0;
            auVar74 = vfmsub231ps_fma(auVar150,auVar88,auVar113);
            auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar81,auVar86);
            auVar82 = vfmadd231ps_avx512vl(auVar86,auVar81,ZEXT1632(auVar75));
            auVar86 = vmaxps_avx(auVar90,auVar82);
            uVar134 = vcmpps_avx512vl(auVar86,auVar81,2);
            bVar70 = bVar70 & (byte)uVar134;
            auVar175 = ZEXT3264(auVar135);
            if (bVar70 != 0) {
              uVar126 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar170._4_4_ = uVar126;
              auVar170._0_4_ = uVar126;
              auVar170._8_4_ = uVar126;
              auVar170._12_4_ = uVar126;
              auVar170._16_4_ = uVar126;
              auVar170._20_4_ = uVar126;
              auVar170._24_4_ = uVar126;
              auVar170._28_4_ = uVar126;
              auVar171 = ZEXT3264(auVar170);
              auVar55._4_4_ = auVar87._4_4_ * auVar83._4_4_;
              auVar55._0_4_ = auVar87._0_4_ * auVar83._0_4_;
              auVar55._8_4_ = auVar87._8_4_ * auVar83._8_4_;
              auVar55._12_4_ = auVar87._12_4_ * auVar83._12_4_;
              auVar55._16_4_ = auVar87._16_4_ * auVar83._16_4_;
              auVar55._20_4_ = auVar87._20_4_ * auVar83._20_4_;
              auVar55._24_4_ = auVar87._24_4_ * auVar83._24_4_;
              auVar55._28_4_ = auVar86._28_4_;
              auVar73 = vfmsub231ps_fma(auVar55,auVar88,auVar84);
              auVar56._4_4_ = auVar84._4_4_ * auVar85._4_4_;
              auVar56._0_4_ = auVar84._0_4_ * auVar85._0_4_;
              auVar56._8_4_ = auVar84._8_4_ * auVar85._8_4_;
              auVar56._12_4_ = auVar84._12_4_ * auVar85._12_4_;
              auVar56._16_4_ = auVar84._16_4_ * auVar85._16_4_;
              auVar56._20_4_ = auVar84._20_4_ * auVar85._20_4_;
              auVar56._24_4_ = auVar84._24_4_ * auVar85._24_4_;
              auVar56._28_4_ = auVar84._28_4_;
              auVar74 = vfmsub231ps_fma(auVar56,auVar96,auVar87);
              auVar57._4_4_ = auVar88._4_4_ * auVar96._4_4_;
              auVar57._0_4_ = auVar88._0_4_ * auVar96._0_4_;
              auVar57._8_4_ = auVar88._8_4_ * auVar96._8_4_;
              auVar57._12_4_ = auVar88._12_4_ * auVar96._12_4_;
              auVar57._16_4_ = auVar88._16_4_ * auVar96._16_4_;
              auVar57._20_4_ = auVar88._20_4_ * auVar96._20_4_;
              auVar57._24_4_ = auVar88._24_4_ * auVar96._24_4_;
              auVar57._28_4_ = auVar88._28_4_;
              auVar5 = vfmsub231ps_fma(auVar57,auVar85,auVar83);
              auVar75 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar74),ZEXT1632(auVar5));
              auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar73),auVar81);
              auVar83 = vrcp14ps_avx512vl(auVar86);
              auVar85 = auVar183._0_32_;
              auVar84 = vfnmadd213ps_avx512vl(auVar83,auVar86,auVar85);
              auVar75 = vfmadd132ps_fma(auVar84,auVar83,auVar83);
              auVar58._4_4_ = auVar5._4_4_ * auVar112._4_4_;
              auVar58._0_4_ = auVar5._0_4_ * auVar112._0_4_;
              auVar58._8_4_ = auVar5._8_4_ * auVar112._8_4_;
              auVar58._12_4_ = auVar5._12_4_ * auVar112._12_4_;
              auVar58._16_4_ = fVar125 * 0.0;
              auVar58._20_4_ = fVar141 * 0.0;
              auVar58._24_4_ = fVar133 * 0.0;
              auVar58._28_4_ = iVar1;
              auVar74 = vfmadd231ps_fma(auVar58,auVar89,ZEXT1632(auVar74));
              auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar95,ZEXT1632(auVar73));
              fVar133 = auVar75._0_4_;
              fVar125 = auVar75._4_4_;
              fVar141 = auVar75._8_4_;
              fVar132 = auVar75._12_4_;
              local_260 = ZEXT1632(CONCAT412(auVar74._12_4_ * fVar132,
                                             CONCAT48(auVar74._8_4_ * fVar141,
                                                      CONCAT44(auVar74._4_4_ * fVar125,
                                                               auVar74._0_4_ * fVar133))));
              uVar134 = vcmpps_avx512vl(local_260,auVar170,2);
              auVar62._4_4_ = uStack_2bc;
              auVar62._0_4_ = local_2c0;
              auVar62._8_4_ = uStack_2b8;
              auVar62._12_4_ = uStack_2b4;
              auVar62._16_4_ = uStack_2b0;
              auVar62._20_4_ = uStack_2ac;
              auVar62._24_4_ = uStack_2a8;
              auVar62._28_4_ = uStack_2a4;
              uVar18 = vcmpps_avx512vl(local_260,auVar62,0xd);
              bVar70 = (byte)uVar134 & (byte)uVar18 & bVar70;
              if (bVar70 != 0) {
                uVar134 = vcmpps_avx512vl(auVar86,auVar81,4);
                bVar70 = bVar70 & (byte)uVar134;
                auVar160 = ZEXT1664(local_5d0);
                auVar176 = ZEXT3264(local_560);
                if (bVar70 != 0) {
                  fVar154 = auVar90._0_4_ * fVar133;
                  fVar157 = auVar90._4_4_ * fVar125;
                  auVar59._4_4_ = fVar157;
                  auVar59._0_4_ = fVar154;
                  fVar153 = auVar90._8_4_ * fVar141;
                  auVar59._8_4_ = fVar153;
                  fVar156 = auVar90._12_4_ * fVar132;
                  auVar59._12_4_ = fVar156;
                  fVar140 = auVar90._16_4_ * 0.0;
                  auVar59._16_4_ = fVar140;
                  fVar72 = auVar90._20_4_ * 0.0;
                  auVar59._20_4_ = fVar72;
                  fVar118 = auVar90._24_4_ * 0.0;
                  auVar59._24_4_ = fVar118;
                  auVar59._28_4_ = auVar86._28_4_;
                  auVar83 = vsubps_avx512vl(auVar85,auVar59);
                  local_2a0._0_4_ =
                       (float)((uint)(bVar63 & 1) * (int)fVar154 |
                              (uint)!(bool)(bVar63 & 1) * auVar83._0_4_);
                  bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
                  local_2a0._4_4_ =
                       (float)((uint)bVar12 * (int)fVar157 | (uint)!bVar12 * auVar83._4_4_);
                  bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
                  local_2a0._8_4_ =
                       (float)((uint)bVar12 * (int)fVar153 | (uint)!bVar12 * auVar83._8_4_);
                  bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
                  local_2a0._12_4_ =
                       (float)((uint)bVar12 * (int)fVar156 | (uint)!bVar12 * auVar83._12_4_);
                  bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
                  local_2a0._16_4_ =
                       (float)((uint)bVar12 * (int)fVar140 | (uint)!bVar12 * auVar83._16_4_);
                  bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
                  local_2a0._20_4_ =
                       (float)((uint)bVar12 * (int)fVar72 | (uint)!bVar12 * auVar83._20_4_);
                  bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
                  local_2a0._24_4_ =
                       (float)((uint)bVar12 * (int)fVar118 | (uint)!bVar12 * auVar83._24_4_);
                  bVar12 = SUB81(uVar71 >> 7,0);
                  local_2a0._28_4_ =
                       (float)((uint)bVar12 * auVar86._28_4_ | (uint)!bVar12 * auVar83._28_4_);
                  auVar86 = vsubps_avx(ZEXT1632(auVar77),auVar91);
                  auVar75 = vfmadd213ps_fma(auVar86,local_2a0,auVar91);
                  uVar126 = *(undefined4 *)((long)local_5e0->ray_space + k * 4 + -0x10);
                  auVar24._4_4_ = uVar126;
                  auVar24._0_4_ = uVar126;
                  auVar24._8_4_ = uVar126;
                  auVar24._12_4_ = uVar126;
                  auVar24._16_4_ = uVar126;
                  auVar24._20_4_ = uVar126;
                  auVar24._24_4_ = uVar126;
                  auVar24._28_4_ = uVar126;
                  auVar86 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar75._12_4_ + auVar75._12_4_,
                                                               CONCAT48(auVar75._8_4_ +
                                                                        auVar75._8_4_,
                                                                        CONCAT44(auVar75._4_4_ +
                                                                                 auVar75._4_4_,
                                                                                 auVar75._0_4_ +
                                                                                 auVar75._0_4_)))),
                                            auVar24);
                  uVar134 = vcmpps_avx512vl(local_260,auVar86,6);
                  if (((byte)uVar134 & bVar70) != 0) {
                    auVar136._0_4_ = auVar82._0_4_ * fVar133;
                    auVar136._4_4_ = auVar82._4_4_ * fVar125;
                    auVar136._8_4_ = auVar82._8_4_ * fVar141;
                    auVar136._12_4_ = auVar82._12_4_ * fVar132;
                    auVar136._16_4_ = auVar82._16_4_ * 0.0;
                    auVar136._20_4_ = auVar82._20_4_ * 0.0;
                    auVar136._24_4_ = auVar82._24_4_ * 0.0;
                    auVar136._28_4_ = 0;
                    auVar86 = vsubps_avx512vl(auVar85,auVar136);
                    auVar117._0_4_ =
                         (uint)(bVar63 & 1) * (int)auVar136._0_4_ |
                         (uint)!(bool)(bVar63 & 1) * auVar86._0_4_;
                    bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
                    auVar117._4_4_ =
                         (uint)bVar12 * (int)auVar136._4_4_ | (uint)!bVar12 * auVar86._4_4_;
                    bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
                    auVar117._8_4_ =
                         (uint)bVar12 * (int)auVar136._8_4_ | (uint)!bVar12 * auVar86._8_4_;
                    bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
                    auVar117._12_4_ =
                         (uint)bVar12 * (int)auVar136._12_4_ | (uint)!bVar12 * auVar86._12_4_;
                    bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
                    auVar117._16_4_ =
                         (uint)bVar12 * (int)auVar136._16_4_ | (uint)!bVar12 * auVar86._16_4_;
                    bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
                    auVar117._20_4_ =
                         (uint)bVar12 * (int)auVar136._20_4_ | (uint)!bVar12 * auVar86._20_4_;
                    bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
                    auVar117._24_4_ =
                         (uint)bVar12 * (int)auVar136._24_4_ | (uint)!bVar12 * auVar86._24_4_;
                    auVar117._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar86._28_4_;
                    auVar25._8_4_ = 0x40000000;
                    auVar25._0_8_ = 0x4000000040000000;
                    auVar25._12_4_ = 0x40000000;
                    auVar25._16_4_ = 0x40000000;
                    auVar25._20_4_ = 0x40000000;
                    auVar25._24_4_ = 0x40000000;
                    auVar25._28_4_ = 0x40000000;
                    local_280 = vfmsub132ps_avx512vl(auVar117,auVar85,auVar25);
                    local_240 = (undefined4)lVar68;
                    local_230 = local_5d0;
                    local_220 = local_510._0_8_;
                    uStack_218 = local_510._8_8_;
                    local_210 = local_520._0_8_;
                    uStack_208 = local_520._8_8_;
                    pGVar69 = (context->scene->geometries).items[local_5d8].ptr;
                    if ((pGVar69->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      bVar63 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar63 = 1, pGVar69->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar75 = vcvtsi2ss_avx512f(auVar177._0_16_,local_240);
                      fVar133 = auVar75._0_4_;
                      local_1e0[0] = (fVar133 + local_2a0._0_4_ + 0.0) * (float)local_380;
                      local_1e0[1] = (fVar133 + local_2a0._4_4_ + 1.0) * local_380._4_4_;
                      local_1e0[2] = (fVar133 + local_2a0._8_4_ + 2.0) * fStack_378;
                      local_1e0[3] = (fVar133 + local_2a0._12_4_ + 3.0) * fStack_374;
                      fStack_1d0 = (fVar133 + local_2a0._16_4_ + 4.0) * fStack_370;
                      fStack_1cc = (fVar133 + local_2a0._20_4_ + 5.0) * fStack_36c;
                      fStack_1c8 = (fVar133 + local_2a0._24_4_ + 6.0) * fStack_368;
                      fStack_1c4 = fVar133 + local_2a0._28_4_ + 7.0;
                      local_1c0 = local_280;
                      local_1a0 = local_260;
                      uVar71 = CONCAT71(0,(byte)uVar134 & bVar70);
                      local_5c0._0_8_ = uVar71;
                      lVar20 = 0;
                      for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
                        lVar20 = lVar20 + 1;
                      }
                      local_5b0._0_8_ = lVar20;
                      local_3e0._0_4_ = (int)uVar64;
                      local_180 = auVar170;
                      local_598 = pGVar69;
                      local_23c = iVar10;
                      do {
                        auVar74 = auVar180._0_16_;
                        local_320 = local_1e0[local_5b0._0_8_];
                        local_310 = *(undefined4 *)(local_1c0 + local_5b0._0_8_ * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1a0 + local_5b0._0_8_ * 4);
                        local_590.context = context->user;
                        fVar125 = 1.0 - local_320;
                        fVar133 = fVar125 * fVar125 * -3.0;
                        auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar125 * fVar125)),
                                                  ZEXT416((uint)(local_320 * fVar125)),
                                                  ZEXT416(0xc0000000));
                        auVar77 = vfmsub132ss_fma(ZEXT416((uint)(local_320 * fVar125)),
                                                  ZEXT416((uint)(local_320 * local_320)),
                                                  ZEXT416(0x40000000));
                        fVar125 = auVar75._0_4_ * 3.0;
                        fVar141 = auVar77._0_4_ * 3.0;
                        fVar132 = local_320 * local_320 * 3.0;
                        auVar152._0_4_ = fVar132 * (float)local_390._0_4_;
                        auVar152._4_4_ = fVar132 * (float)local_390._4_4_;
                        auVar152._8_4_ = fVar132 * fStack_388;
                        auVar152._12_4_ = fVar132 * fStack_384;
                        auVar129._4_4_ = fVar141;
                        auVar129._0_4_ = fVar141;
                        auVar129._8_4_ = fVar141;
                        auVar129._12_4_ = fVar141;
                        auVar75 = vfmadd132ps_fma(auVar129,auVar152,local_520);
                        auVar144._4_4_ = fVar125;
                        auVar144._0_4_ = fVar125;
                        auVar144._8_4_ = fVar125;
                        auVar144._12_4_ = fVar125;
                        auVar75 = vfmadd132ps_fma(auVar144,auVar75,local_510);
                        auVar130._4_4_ = fVar133;
                        auVar130._0_4_ = fVar133;
                        auVar130._8_4_ = fVar133;
                        auVar130._12_4_ = fVar133;
                        auVar75 = vfmadd213ps_fma(auVar130,auVar160._0_16_,auVar75);
                        local_350 = auVar75._0_4_;
                        local_340 = vshufps_avx(auVar75,auVar75,0x55);
                        local_330 = vshufps_avx(auVar75,auVar75,0xaa);
                        local_300 = local_530._0_8_;
                        uStack_2f8 = local_530._8_8_;
                        local_2f0 = local_540;
                        vpcmpeqd_avx2(ZEXT1632(local_540),ZEXT1632(local_540));
                        uStack_2dc = (local_590.context)->instID[0];
                        local_2e0 = uStack_2dc;
                        uStack_2d8 = uStack_2dc;
                        uStack_2d4 = uStack_2dc;
                        uStack_2d0 = (local_590.context)->instPrimID[0];
                        uStack_2cc = uStack_2d0;
                        uStack_2c8 = uStack_2d0;
                        uStack_2c4 = uStack_2d0;
                        local_5f0 = local_3a0;
                        local_590.valid = (int *)local_5f0;
                        local_590.geometryUserPtr = pGVar69->userPtr;
                        local_590.hit = (RTCHitN *)&local_350;
                        local_590.N = 4;
                        local_590.ray = (RTCRayN *)ray;
                        uStack_34c = local_350;
                        uStack_348 = local_350;
                        uStack_344 = local_350;
                        fStack_31c = local_320;
                        fStack_318 = local_320;
                        fStack_314 = local_320;
                        uStack_30c = local_310;
                        uStack_308 = local_310;
                        uStack_304 = local_310;
                        if (pGVar69->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar69->occlusionFilterN)(&local_590);
                          auVar171 = ZEXT3264(local_180);
                          uVar64 = (ulong)(uint)local_3e0._0_4_;
                          auVar176 = ZEXT3264(local_560);
                          auVar175 = ZEXT3264(local_440);
                          auVar179 = ZEXT3264(local_420);
                          auVar178 = ZEXT3264(local_400);
                          auVar177 = ZEXT3264(local_3c0);
                          auVar160 = ZEXT1664(local_5d0);
                          auVar75 = vxorps_avx512vl(auVar74,auVar74);
                          auVar180 = ZEXT1664(auVar75);
                          auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar183 = ZEXT3264(auVar86);
                          pGVar69 = local_598;
                        }
                        auVar75 = auVar180._0_16_;
                        uVar71 = vptestmd_avx512vl(local_5f0,local_5f0);
                        if ((uVar71 & 0xf) == 0) {
                          auVar181 = ZEXT3264(local_4c0);
                          auVar184 = ZEXT3264(local_4e0);
                          auVar182 = ZEXT3264(local_500);
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar69->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var11)(&local_590);
                            auVar171 = ZEXT3264(local_180);
                            uVar64 = (ulong)(uint)local_3e0._0_4_;
                            auVar176 = ZEXT3264(local_560);
                            auVar175 = ZEXT3264(local_440);
                            auVar179 = ZEXT3264(local_420);
                            auVar178 = ZEXT3264(local_400);
                            auVar177 = ZEXT3264(local_3c0);
                            auVar160 = ZEXT1664(local_5d0);
                            auVar75 = vxorps_avx512vl(auVar75,auVar75);
                            auVar180 = ZEXT1664(auVar75);
                            auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar183 = ZEXT3264(auVar86);
                            pGVar69 = local_598;
                          }
                          uVar71 = vptestmd_avx512vl(local_5f0,local_5f0);
                          uVar71 = uVar71 & 0xf;
                          auVar75 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar12 = (bool)((byte)uVar71 & 1);
                          bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
                          bVar15 = SUB81(uVar71 >> 3,0);
                          *(uint *)(local_590.ray + 0x80) =
                               (uint)bVar12 * auVar75._0_4_ |
                               (uint)!bVar12 * *(int *)(local_590.ray + 0x80);
                          *(uint *)(local_590.ray + 0x84) =
                               (uint)bVar13 * auVar75._4_4_ |
                               (uint)!bVar13 * *(int *)(local_590.ray + 0x84);
                          *(uint *)(local_590.ray + 0x88) =
                               (uint)bVar14 * auVar75._8_4_ |
                               (uint)!bVar14 * *(int *)(local_590.ray + 0x88);
                          *(uint *)(local_590.ray + 0x8c) =
                               (uint)bVar15 * auVar75._12_4_ |
                               (uint)!bVar15 * *(int *)(local_590.ray + 0x8c);
                          auVar181 = ZEXT3264(local_4c0);
                          auVar184 = ZEXT3264(local_4e0);
                          auVar182 = ZEXT3264(local_500);
                          if ((byte)uVar71 != 0) {
                            bVar63 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x80) = auVar171._0_4_;
                        local_5c0._0_8_ = local_5c0._0_8_ ^ 1L << (local_5b0._0_8_ & 0x3f);
                        bVar63 = 0;
                        lVar20 = 0;
                        for (uVar71 = local_5c0._0_8_; (uVar71 & 1) == 0;
                            uVar71 = uVar71 >> 1 | 0x8000000000000000) {
                          lVar20 = lVar20 + 1;
                        }
                        local_5b0._0_8_ = lVar20;
                      } while (local_5c0._0_8_ != 0);
                    }
                    uVar64 = CONCAT71((int7)(uVar64 >> 8),(byte)uVar64 | bVar63);
                  }
                }
                goto LAB_01c8688f;
              }
            }
            auVar176 = ZEXT3264(local_560);
          }
LAB_01c8688f:
          lVar68 = lVar68 + 8;
        } while ((int)lVar68 < iVar10);
      }
      bVar70 = (byte)uVar64;
      if ((uVar64 & 1) != 0) break;
      uVar126 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar23._4_4_ = uVar126;
      auVar23._0_4_ = uVar126;
      auVar23._8_4_ = uVar126;
      auVar23._12_4_ = uVar126;
      auVar23._16_4_ = uVar126;
      auVar23._20_4_ = uVar126;
      auVar23._24_4_ = uVar126;
      auVar23._28_4_ = uVar126;
      uVar134 = vcmpps_avx512vl(local_80,auVar23,2);
      uVar65 = (uint)uVar66 & (uint)uVar134;
      uVar66 = (ulong)uVar65;
    } while (uVar65 != 0);
  }
  return (bool)(bVar70 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }